

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void idct32x32_low16_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  uint uVar47;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  uint uVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  uint uVar64;
  undefined1 auVar48 [16];
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  uint uVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  uint uVar77;
  int iVar82;
  int iVar87;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  undefined1 auVar80 [16];
  uint uVar86;
  uint uVar91;
  uint uVar96;
  undefined1 auVar81 [16];
  uint uVar97;
  uint uVar98;
  uint uVar103;
  uint uVar105;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  uint uVar104;
  uint uVar106;
  uint uVar107;
  uint uVar108;
  undefined1 auVar102 [16];
  int iVar109;
  int iVar110;
  uint uVar111;
  int iVar118;
  int iVar121;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  int iVar119;
  uint uVar120;
  int iVar122;
  int iVar123;
  uint uVar124;
  int iVar125;
  int iVar126;
  int iVar127;
  uint uVar128;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  int iVar135;
  int iVar136;
  int iVar137;
  int iVar146;
  int iVar147;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  int iVar148;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  int iVar149;
  uint uVar150;
  int iVar161;
  int iVar163;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  int iVar165;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  uint uVar162;
  uint uVar164;
  uint uVar166;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  int iVar167;
  int iVar168;
  int iVar175;
  int iVar177;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  int iVar179;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  int iVar176;
  int iVar178;
  undefined1 auVar173 [16];
  int iVar180;
  undefined1 auVar174 [16];
  int iVar184;
  int iVar185;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  int iVar186;
  uint uVar187;
  int iVar195;
  int iVar197;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  int iVar199;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  uint uVar196;
  uint uVar198;
  uint uVar200;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  int iVar201;
  int iVar205;
  int iVar206;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  int iVar207;
  undefined1 auVar204 [16];
  uint uVar208;
  uint uVar211;
  uint uVar212;
  uint uVar213;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  int iVar218;
  int iVar219;
  int iVar221;
  int iVar222;
  uint uVar223;
  int iVar231;
  int iVar236;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  uint uVar220;
  uint uVar232;
  uint uVar237;
  int iVar241;
  uint uVar242;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  int iVar233;
  int iVar234;
  uint uVar235;
  int iVar238;
  int iVar239;
  uint uVar240;
  int iVar243;
  int iVar244;
  uint uVar245;
  undefined1 auVar230 [16];
  __m128i clamp_hi;
  __m128i clamp_lo;
  int local_4d8;
  int iStack_4d4;
  int iStack_4d0;
  int iStack_4cc;
  int local_4c8;
  int iStack_4c4;
  int iStack_4c0;
  int iStack_4bc;
  int local_4b8;
  int iStack_4b4;
  int iStack_4b0;
  int iStack_4ac;
  int local_4a8;
  int iStack_4a4;
  int iStack_4a0;
  int iStack_49c;
  int local_488;
  int iStack_484;
  int iStack_480;
  int iStack_47c;
  int local_478;
  int iStack_474;
  int iStack_470;
  int iStack_46c;
  int local_468;
  int iStack_464;
  int iStack_460;
  int iStack_45c;
  int local_458;
  int iStack_454;
  int iStack_450;
  int iStack_44c;
  undefined1 local_448 [16];
  int local_438;
  int iStack_434;
  int iStack_430;
  int iStack_42c;
  int local_418;
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint local_228;
  uint uStack_224;
  uint uStack_220;
  uint uStack_21c;
  uint local_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  uint local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint local_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint local_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint local_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint local_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint local_108;
  uint uStack_104;
  uint uStack_100;
  uint uStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  lVar11 = (long)bit * 0x100;
  iVar12 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x248);
  iVar30 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x208);
  iVar33 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x228);
  iVar36 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x1e8);
  iVar40 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x230);
  iVar41 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x1f0);
  iVar136 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x240);
  iVar168 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1c0);
  iVar176 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x200);
  iVar178 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x180);
  iVar5 = -iVar176;
  iVar10 = -iVar178;
  iVar8 = -iVar136;
  iVar2 = -iVar168;
  iVar137 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1e0);
  iVar3 = -iVar137;
  iVar184 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x220);
  iVar4 = -iVar184;
  iVar185 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1a0);
  iVar9 = 1 << ((char)bit - 1U & 0x1f);
  iVar6 = -iVar185;
  iVar7 = bd + 6 + (uint)(do_cols == 0) * 2;
  local_258 = 0x8000;
  if (0xf < iVar7) {
    local_258 = 1 << ((char)iVar7 - 1U & 0x1f);
  }
  local_248 = -local_258;
  local_258 = local_258 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 600);
  auVar224._4_4_ = uVar1;
  auVar224._0_4_ = uVar1;
  auVar224._8_4_ = uVar1;
  auVar224._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1d8);
  auVar99._4_4_ = uVar1;
  auVar99._0_4_ = uVar1;
  auVar99._8_4_ = uVar1;
  auVar99._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x218);
  auVar129._4_4_ = uVar1;
  auVar129._0_4_ = uVar1;
  auVar129._8_4_ = uVar1;
  auVar129._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1a8);
  auVar112._4_4_ = uVar1;
  auVar112._0_4_ = uVar1;
  auVar112._8_4_ = uVar1;
  auVar112._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x168);
  auVar133._4_4_ = uVar1;
  auVar133._0_4_ = uVar1;
  auVar133._8_4_ = uVar1;
  auVar133._12_4_ = uVar1;
  auVar138._4_4_ = iVar36;
  auVar138._0_4_ = iVar36;
  auVar138._8_4_ = iVar36;
  auVar138._12_4_ = iVar36;
  auVar78 = pmulld(auVar133,(undefined1  [16])in[1]);
  auVar225 = pmulld(auVar224,(undefined1  [16])in[1]);
  auVar139 = pmulld(auVar138,(undefined1  [16])in[0xf]);
  auVar100 = pmulld(auVar99,(undefined1  [16])in[0xf]);
  auVar113 = pmulld(auVar112,(undefined1  [16])in[9]);
  auVar130 = pmulld(auVar129,(undefined1  [16])in[9]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x198);
  auVar13._4_4_ = uVar1;
  auVar13._0_4_ = uVar1;
  auVar13._8_4_ = uVar1;
  auVar13._12_4_ = uVar1;
  auVar151._4_4_ = iVar33;
  auVar151._0_4_ = iVar33;
  auVar151._8_4_ = iVar33;
  auVar151._12_4_ = iVar33;
  auVar152 = pmulld(auVar151,(undefined1  [16])in[7]);
  auVar13 = pmulld(auVar13,(undefined1  [16])in[7]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x238);
  auVar169._4_4_ = uVar1;
  auVar169._0_4_ = uVar1;
  auVar169._8_4_ = uVar1;
  auVar169._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x188);
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  auVar14 = pmulld(auVar14,(undefined1  [16])in[5]);
  auVar170 = pmulld(auVar169,(undefined1  [16])in[5]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1b8);
  auVar188._4_4_ = uVar1;
  auVar188._0_4_ = uVar1;
  auVar188._8_4_ = uVar1;
  auVar188._12_4_ = uVar1;
  auVar215._4_4_ = iVar30;
  auVar215._0_4_ = iVar30;
  auVar215._8_4_ = iVar30;
  auVar215._12_4_ = iVar30;
  auVar79 = pmulld(auVar215,(undefined1  [16])in[0xb]);
  auVar189 = pmulld(auVar188,(undefined1  [16])in[0xb]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1f8);
  auVar182._4_4_ = uVar1;
  auVar182._0_4_ = uVar1;
  auVar182._8_4_ = uVar1;
  auVar182._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1c8);
  auVar114._4_4_ = uVar1;
  auVar114._0_4_ = uVar1;
  auVar114._8_4_ = uVar1;
  auVar114._12_4_ = uVar1;
  auVar115 = pmulld(auVar114,(undefined1  [16])in[0xd]);
  auVar48 = pmulld(auVar182,(undefined1  [16])in[0xd]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x178);
  auVar15._4_4_ = uVar1;
  auVar15._0_4_ = uVar1;
  auVar15._8_4_ = uVar1;
  auVar15._12_4_ = uVar1;
  auVar202._4_4_ = iVar12;
  auVar202._0_4_ = iVar12;
  auVar202._8_4_ = iVar12;
  auVar202._12_4_ = iVar12;
  auVar203 = pmulld(auVar202,(undefined1  [16])in[3]);
  auVar15 = pmulld(auVar15,(undefined1  [16])in[3]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x250);
  auVar131._4_4_ = uVar1;
  auVar131._0_4_ = uVar1;
  auVar131._8_4_ = uVar1;
  auVar131._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x170);
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar16 = pmulld(auVar16,(undefined1  [16])in[2]);
  auVar132 = pmulld(auVar131,(undefined1  [16])in[2]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1d0);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar181._4_4_ = iVar41;
  auVar181._0_4_ = iVar41;
  auVar181._8_4_ = iVar41;
  auVar181._12_4_ = iVar41;
  auVar182 = pmulld(auVar181,(undefined1  [16])in[0xe]);
  auVar17 = pmulld(auVar17,(undefined1  [16])in[0xe]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x210);
  auVar214._4_4_ = uVar1;
  auVar214._0_4_ = uVar1;
  auVar214._8_4_ = uVar1;
  auVar214._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1b0);
  auVar18._4_4_ = uVar1;
  auVar18._0_4_ = uVar1;
  auVar18._8_4_ = uVar1;
  auVar18._12_4_ = uVar1;
  auVar18 = pmulld(auVar18,(undefined1  [16])in[10]);
  auVar215 = pmulld(auVar214,(undefined1  [16])in[10]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 400);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  auVar140._4_4_ = iVar40;
  auVar140._0_4_ = iVar40;
  auVar140._8_4_ = iVar40;
  auVar140._12_4_ = iVar40;
  auVar141 = pmulld(auVar140,(undefined1  [16])in[6]);
  auVar19 = pmulld(auVar19,(undefined1  [16])in[6]);
  auVar133 = ZEXT416((uint)bit);
  iVar219 = auVar225._0_4_ + iVar9 >> auVar133;
  iVar231 = auVar225._4_4_ + iVar9 >> auVar133;
  iVar236 = auVar225._8_4_ + iVar9 >> auVar133;
  iVar241 = auVar225._12_4_ + iVar9 >> auVar133;
  iVar30 = auVar139._0_4_ + iVar9 >> auVar133;
  iVar33 = auVar139._4_4_ + iVar9 >> auVar133;
  iVar36 = auVar139._8_4_ + iVar9 >> auVar133;
  iVar40 = auVar139._12_4_ + iVar9 >> auVar133;
  iVar12 = iVar30 + iVar219;
  iVar7 = iVar33 + iVar231;
  iVar22 = iVar36 + iVar236;
  iVar25 = iVar40 + iVar241;
  iVar219 = iVar219 - iVar30;
  iVar231 = iVar231 - iVar33;
  iVar236 = iVar236 - iVar36;
  iVar241 = iVar241 - iVar40;
  local_458 = auVar130._0_4_;
  iStack_454 = auVar130._4_4_;
  iStack_450 = auVar130._8_4_;
  iStack_44c = auVar130._12_4_;
  iVar33 = local_458 + iVar9 >> auVar133;
  iVar36 = iStack_454 + iVar9 >> auVar133;
  iVar40 = iStack_450 + iVar9 >> auVar133;
  iVar41 = iStack_44c + iVar9 >> auVar133;
  iVar149 = auVar152._0_4_ + iVar9 >> auVar133;
  iVar161 = auVar152._4_4_ + iVar9 >> auVar133;
  iVar163 = auVar152._8_4_ + iVar9 >> auVar133;
  iVar165 = auVar152._12_4_ + iVar9 >> auVar133;
  iVar167 = auVar170._0_4_ + iVar9 >> auVar133;
  iVar175 = auVar170._4_4_ + iVar9 >> auVar133;
  iVar177 = auVar170._8_4_ + iVar9 >> auVar133;
  iVar179 = auVar170._12_4_ + iVar9 >> auVar133;
  iVar30 = iVar149 + iVar33;
  iVar20 = iVar161 + iVar36;
  iVar23 = iVar163 + iVar40;
  iVar26 = iVar165 + iVar41;
  iVar149 = iVar149 - iVar33;
  iVar161 = iVar161 - iVar36;
  iVar163 = iVar163 - iVar40;
  iVar165 = iVar165 - iVar41;
  iVar36 = auVar79._0_4_ + iVar9 >> auVar133;
  iVar82 = auVar79._4_4_ + iVar9 >> auVar133;
  iVar87 = auVar79._8_4_ + iVar9 >> auVar133;
  iVar92 = auVar79._12_4_ + iVar9 >> auVar133;
  iVar40 = auVar48._0_4_ + iVar9 >> auVar133;
  iVar41 = auVar48._4_4_ + iVar9 >> auVar133;
  iVar56 = auVar48._8_4_ + iVar9 >> auVar133;
  iVar65 = auVar48._12_4_ + iVar9 >> auVar133;
  iVar201 = auVar203._0_4_ + iVar9 >> auVar133;
  iVar205 = auVar203._4_4_ + iVar9 >> auVar133;
  iVar206 = auVar203._8_4_ + iVar9 >> auVar133;
  iVar207 = auVar203._12_4_ + iVar9 >> auVar133;
  iVar33 = iVar36 + iVar167;
  iVar21 = iVar82 + iVar175;
  iVar24 = iVar87 + iVar177;
  iVar27 = iVar92 + iVar179;
  iVar167 = iVar167 - iVar36;
  iVar175 = iVar175 - iVar82;
  iVar177 = iVar177 - iVar87;
  iVar179 = iVar179 - iVar92;
  iVar36 = iVar201 + iVar40;
  iVar82 = iVar205 + iVar41;
  iVar87 = iVar206 + iVar56;
  iVar28 = iVar207 + iVar65;
  iVar201 = iVar201 - iVar40;
  iVar205 = iVar205 - iVar41;
  iVar206 = iVar206 - iVar56;
  iVar207 = iVar207 - iVar65;
  iVar41 = auVar115._0_4_ + iVar9 >> auVar133;
  iVar65 = auVar115._4_4_ + iVar9 >> auVar133;
  iVar121 = auVar115._8_4_ + iVar9 >> auVar133;
  iVar125 = auVar115._12_4_ + iVar9 >> auVar133;
  local_438 = auVar15._0_4_;
  iStack_434 = auVar15._4_4_;
  iStack_430 = auVar15._8_4_;
  iStack_42c = auVar15._12_4_;
  iVar31 = local_438 + iVar9 >> auVar133;
  iVar34 = iStack_434 + iVar9 >> auVar133;
  iVar37 = iStack_430 + iVar9 >> auVar133;
  iVar42 = iStack_42c + iVar9 >> auVar133;
  iVar40 = iVar31 + iVar41;
  iVar56 = iVar34 + iVar65;
  iVar92 = iVar37 + iVar121;
  iVar29 = iVar42 + iVar125;
  iVar31 = iVar31 - iVar41;
  iVar34 = iVar34 - iVar65;
  iVar37 = iVar37 - iVar121;
  iVar42 = iVar42 - iVar125;
  local_478 = auVar78._0_4_;
  iStack_474 = auVar78._4_4_;
  iStack_470 = auVar78._8_4_;
  iStack_46c = auVar78._12_4_;
  iVar41 = local_478 + iVar9 >> auVar133;
  iVar65 = iStack_474 + iVar9 >> auVar133;
  iVar121 = iStack_470 + iVar9 >> auVar133;
  iVar125 = iStack_46c + iVar9 >> auVar133;
  local_4c8 = auVar14._0_4_;
  iStack_4c4 = auVar14._4_4_;
  iStack_4c0 = auVar14._8_4_;
  iStack_4bc = auVar14._12_4_;
  iVar32 = local_4c8 + iVar9 >> auVar133;
  iVar35 = iStack_4c4 + iVar9 >> auVar133;
  iVar38 = iStack_4c0 + iVar9 >> auVar133;
  iVar43 = iStack_4bc + iVar9 >> auVar133;
  iVar186 = auVar189._0_4_ + iVar9 >> auVar133;
  iVar195 = auVar189._4_4_ + iVar9 >> auVar133;
  iVar197 = auVar189._8_4_ + iVar9 >> auVar133;
  iVar199 = auVar189._12_4_ + iVar9 >> auVar133;
  iVar74 = iVar186 + iVar32;
  iVar83 = iVar195 + iVar35;
  iVar88 = iVar197 + iVar38;
  iVar93 = iVar199 + iVar43;
  iVar32 = iVar32 - iVar186;
  iVar35 = iVar35 - iVar195;
  iVar38 = iVar38 - iVar197;
  iVar43 = iVar43 - iVar199;
  local_448._0_4_ = auVar100._0_4_;
  local_448._4_4_ = auVar100._4_4_;
  local_448._8_4_ = auVar100._8_4_;
  local_448._12_4_ = auVar100._12_4_;
  iVar109 = local_448._0_4_ + iVar9 >> auVar133;
  iVar118 = local_448._4_4_ + iVar9 >> auVar133;
  iVar122 = local_448._8_4_ + iVar9 >> auVar133;
  iVar126 = local_448._12_4_ + iVar9 >> auVar133;
  local_4a8 = auVar113._0_4_;
  iStack_4a4 = auVar113._4_4_;
  iStack_4a0 = auVar113._8_4_;
  iStack_49c = auVar113._12_4_;
  iVar195 = local_4a8 + iVar9 >> auVar133;
  iVar199 = iStack_4a4 + iVar9 >> auVar133;
  iVar57 = iStack_4a0 + iVar9 >> auVar133;
  iVar66 = iStack_49c + iVar9 >> auVar133;
  local_4d8 = auVar13._0_4_;
  iStack_4d4 = auVar13._4_4_;
  iStack_4d0 = auVar13._8_4_;
  iStack_4cc = auVar13._12_4_;
  iVar186 = local_4d8 + iVar9 >> auVar133;
  iVar197 = iStack_4d4 + iVar9 >> auVar133;
  iVar39 = iStack_4d0 + iVar9 >> auVar133;
  iVar44 = iStack_4cc + iVar9 >> auVar133;
  iVar75 = iVar186 + iVar195;
  iVar84 = iVar197 + iVar199;
  iVar89 = iVar39 + iVar57;
  iVar94 = iVar44 + iVar66;
  iVar186 = iVar186 - iVar195;
  iVar197 = iVar197 - iVar199;
  iVar39 = iVar39 - iVar57;
  iVar44 = iVar44 - iVar66;
  iVar45 = iVar109 + iVar41;
  iVar49 = iVar118 + iVar65;
  iVar58 = iVar122 + iVar121;
  iVar67 = iVar126 + iVar125;
  iVar41 = iVar41 - iVar109;
  iVar65 = iVar65 - iVar118;
  iVar121 = iVar121 - iVar122;
  iVar125 = iVar125 - iVar126;
  local_468 = auVar132._0_4_;
  iStack_464 = auVar132._4_4_;
  iStack_460 = auVar132._8_4_;
  iStack_45c = auVar132._12_4_;
  iVar109 = local_468 + iVar9 >> auVar133;
  iVar50 = iStack_464 + iVar9 >> auVar133;
  iVar59 = iStack_460 + iVar9 >> auVar133;
  iVar68 = iStack_45c + iVar9 >> auVar133;
  iVar195 = auVar182._0_4_ + iVar9 >> auVar133;
  iVar199 = auVar182._4_4_ + iVar9 >> auVar133;
  iVar57 = auVar182._8_4_ + iVar9 >> auVar133;
  iVar66 = auVar182._12_4_ + iVar9 >> auVar133;
  iVar118 = iVar195 + iVar109;
  iVar51 = iVar199 + iVar50;
  iVar60 = iVar57 + iVar59;
  iVar69 = iVar66 + iVar68;
  iVar109 = iVar109 - iVar195;
  iVar50 = iVar50 - iVar199;
  iVar59 = iVar59 - iVar57;
  iVar68 = iVar68 - iVar66;
  local_488 = auVar16._0_4_;
  iStack_484 = auVar16._4_4_;
  iStack_480 = auVar16._8_4_;
  iStack_47c = auVar16._12_4_;
  iVar122 = local_488 + iVar9 >> auVar133;
  iVar52 = iStack_484 + iVar9 >> auVar133;
  iVar61 = iStack_480 + iVar9 >> auVar133;
  iVar70 = iStack_47c + iVar9 >> auVar133;
  iVar195 = auVar215._0_4_ + iVar9 >> auVar133;
  iVar199 = auVar215._4_4_ + iVar9 >> auVar133;
  iVar57 = auVar215._8_4_ + iVar9 >> auVar133;
  iVar66 = auVar215._12_4_ + iVar9 >> auVar133;
  iVar135 = auVar141._0_4_ + iVar9 >> auVar133;
  iVar146 = auVar141._4_4_ + iVar9 >> auVar133;
  iVar147 = auVar141._8_4_ + iVar9 >> auVar133;
  iVar148 = auVar141._12_4_ + iVar9 >> auVar133;
  iVar126 = iVar135 + iVar195;
  iVar53 = iVar146 + iVar199;
  iVar62 = iVar147 + iVar57;
  iVar71 = iVar148 + iVar66;
  iVar135 = iVar135 - iVar195;
  iVar146 = iVar146 - iVar199;
  iVar147 = iVar147 - iVar57;
  iVar148 = iVar148 - iVar66;
  local_418 = auVar17._0_4_;
  iStack_414 = auVar17._4_4_;
  iStack_410 = auVar17._8_4_;
  iStack_40c = auVar17._12_4_;
  iVar110 = local_418 + iVar9 >> auVar133;
  iVar119 = iStack_414 + iVar9 >> auVar133;
  iVar123 = iStack_410 + iVar9 >> auVar133;
  iVar127 = iStack_40c + iVar9 >> auVar133;
  local_378 = auVar18._0_4_;
  iStack_374 = auVar18._4_4_;
  iStack_370 = auVar18._8_4_;
  iStack_36c = auVar18._12_4_;
  iVar195 = local_378 + iVar9 >> auVar133;
  iVar199 = iStack_374 + iVar9 >> auVar133;
  iVar57 = iStack_370 + iVar9 >> auVar133;
  iVar66 = iStack_36c + iVar9 >> auVar133;
  local_4b8 = auVar19._0_4_;
  iStack_4b4 = auVar19._4_4_;
  iStack_4b0 = auVar19._8_4_;
  iStack_4ac = auVar19._12_4_;
  iVar76 = local_4b8 + iVar9 >> auVar133;
  iVar85 = iStack_4b4 + iVar9 >> auVar133;
  iVar90 = iStack_4b0 + iVar9 >> auVar133;
  iVar95 = iStack_4ac + iVar9 >> auVar133;
  iVar46 = iVar76 + iVar195;
  iVar54 = iVar85 + iVar199;
  iVar63 = iVar90 + iVar57;
  iVar72 = iVar95 + iVar66;
  iVar76 = iVar76 - iVar195;
  iVar85 = iVar85 - iVar199;
  iVar90 = iVar90 - iVar57;
  iVar95 = iVar95 - iVar66;
  iVar195 = iVar110 + iVar122;
  iVar199 = iVar119 + iVar52;
  iVar57 = iVar123 + iVar61;
  iVar66 = iVar127 + iVar70;
  iVar122 = iVar122 - iVar110;
  iVar52 = iVar52 - iVar119;
  iVar61 = iVar61 - iVar123;
  iVar70 = iVar70 - iVar127;
  auVar225._4_4_ = iVar136;
  auVar225._0_4_ = iVar136;
  auVar225._8_4_ = iVar136;
  auVar225._12_4_ = iVar136;
  auVar170._4_4_ = iVar10;
  auVar170._0_4_ = iVar10;
  auVar170._8_4_ = iVar10;
  auVar170._12_4_ = iVar10;
  uVar220 = (uint)(iVar219 < local_248) * local_248 | (uint)(iVar219 >= local_248) * iVar219;
  uVar232 = (uint)(iVar231 < local_248) * local_248 | (uint)(iVar231 >= local_248) * iVar231;
  uVar237 = (uint)(iVar236 < local_248) * local_248 | (uint)(iVar236 >= local_248) * iVar236;
  uVar242 = (uint)(iVar241 < local_248) * local_248 | (uint)(iVar241 >= local_248) * iVar241;
  auVar226._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar226._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar226._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar226._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar41 < local_248) * local_248 | (uint)(iVar41 >= local_248) * iVar41;
  uVar232 = (uint)(iVar65 < local_248) * local_248 | (uint)(iVar65 >= local_248) * iVar65;
  uVar237 = (uint)(iVar121 < local_248) * local_248 | (uint)(iVar121 >= local_248) * iVar121;
  uVar242 = (uint)(iVar125 < local_248) * local_248 | (uint)(iVar125 >= local_248) * iVar125;
  auVar48._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar48._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar48._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar48._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  auVar19 = pmulld(auVar226,auVar170);
  auVar115 = pmulld(auVar48,auVar225);
  auVar142._4_4_ = iVar178;
  auVar142._0_4_ = iVar178;
  auVar142._8_4_ = iVar178;
  auVar142._12_4_ = iVar178;
  auVar227 = pmulld(auVar226,auVar225);
  auVar13 = pmulld(auVar48,auVar142);
  auVar190._4_4_ = iVar8;
  auVar190._0_4_ = iVar8;
  auVar190._8_4_ = iVar8;
  auVar190._12_4_ = iVar8;
  uVar220 = (uint)(iVar149 < local_248) * local_248 | (uint)(iVar149 >= local_248) * iVar149;
  uVar232 = (uint)(iVar161 < local_248) * local_248 | (uint)(iVar161 >= local_248) * iVar161;
  uVar237 = (uint)(iVar163 < local_248) * local_248 | (uint)(iVar163 >= local_248) * iVar163;
  uVar242 = (uint)(iVar165 < local_248) * local_248 | (uint)(iVar165 >= local_248) * iVar165;
  auVar153._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar153._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar153._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar153._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar186 < local_248) * local_248 | (uint)(iVar186 >= local_248) * iVar186;
  uVar232 = (uint)(iVar197 < local_248) * local_248 | (uint)(iVar197 >= local_248) * iVar197;
  uVar237 = (uint)(iVar39 < local_248) * local_248 | (uint)(iVar39 >= local_248) * iVar39;
  uVar242 = (uint)(iVar44 < local_248) * local_248 | (uint)(iVar44 >= local_248) * iVar44;
  auVar78._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar78._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar78._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar78._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  auVar189 = pmulld(auVar190,auVar153);
  auVar182 = pmulld(auVar78,auVar170);
  auVar130 = pmulld(auVar153,auVar170);
  auVar17 = pmulld(auVar142,(undefined1  [16])in[4]);
  auVar16 = pmulld((undefined1  [16])in[4],auVar225);
  auVar14 = pmulld(auVar78,auVar225);
  auVar154._4_4_ = iVar168;
  auVar154._0_4_ = iVar168;
  auVar154._8_4_ = iVar168;
  auVar154._12_4_ = iVar168;
  auVar191._4_4_ = iVar5;
  auVar191._0_4_ = iVar5;
  auVar191._8_4_ = iVar5;
  auVar191._12_4_ = iVar5;
  uVar220 = (uint)(iVar167 < local_248) * local_248 | (uint)(iVar167 >= local_248) * iVar167;
  uVar232 = (uint)(iVar175 < local_248) * local_248 | (uint)(iVar175 >= local_248) * iVar175;
  uVar237 = (uint)(iVar177 < local_248) * local_248 | (uint)(iVar177 >= local_248) * iVar177;
  uVar242 = (uint)(iVar179 < local_248) * local_248 | (uint)(iVar179 >= local_248) * iVar179;
  auVar171._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar171._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar171._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar171._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar32 < local_248) * local_248 | (uint)(iVar32 >= local_248) * iVar32;
  uVar232 = (uint)(iVar35 < local_248) * local_248 | (uint)(iVar35 >= local_248) * iVar35;
  uVar237 = (uint)(iVar38 < local_248) * local_248 | (uint)(iVar38 >= local_248) * iVar38;
  uVar242 = (uint)(iVar43 < local_248) * local_248 | (uint)(iVar43 >= local_248) * iVar43;
  auVar79._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar79._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar79._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar79._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  auVar225 = pmulld(auVar171,auVar191);
  auVar18 = pmulld(auVar79,auVar154);
  auVar228._4_4_ = iVar176;
  auVar228._0_4_ = iVar176;
  auVar228._8_4_ = iVar176;
  auVar228._12_4_ = iVar176;
  auVar15 = pmulld(auVar79,auVar228);
  auVar139 = pmulld(auVar171,auVar154);
  auVar172._4_4_ = iVar2;
  auVar172._0_4_ = iVar2;
  auVar172._8_4_ = iVar2;
  auVar172._12_4_ = iVar2;
  uVar220 = (uint)(iVar201 < local_248) * local_248 | (uint)(iVar201 >= local_248) * iVar201;
  uVar232 = (uint)(iVar205 < local_248) * local_248 | (uint)(iVar205 >= local_248) * iVar205;
  uVar237 = (uint)(iVar206 < local_248) * local_248 | (uint)(iVar206 >= local_248) * iVar206;
  uVar242 = (uint)(iVar207 < local_248) * local_248 | (uint)(iVar207 >= local_248) * iVar207;
  auVar204._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar204._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar204._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar204._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar31 < local_248) * local_248 | (uint)(iVar31 >= local_248) * iVar31;
  uVar232 = (uint)(iVar34 < local_248) * local_248 | (uint)(iVar34 >= local_248) * iVar34;
  uVar237 = (uint)(iVar37 < local_248) * local_248 | (uint)(iVar37 >= local_248) * iVar37;
  uVar242 = (uint)(iVar42 < local_248) * local_248 | (uint)(iVar42 >= local_248) * iVar42;
  auVar216._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar216._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar216._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar216._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  auVar141 = pmulld(auVar172,auVar204);
  auVar229 = pmulld(auVar216,auVar191);
  auVar170 = pmulld(auVar204,auVar191);
  auVar78 = pmulld(auVar191,(undefined1  [16])in[0xc]);
  auVar48 = pmulld((undefined1  [16])in[0xc],auVar154);
  auVar215 = pmulld(auVar216,auVar154);
  iVar136 = auVar17._0_4_ + iVar9 >> auVar133;
  iVar41 = auVar17._4_4_ + iVar9 >> auVar133;
  iVar2 = auVar17._8_4_ + iVar9 >> auVar133;
  iVar10 = auVar17._12_4_ + iVar9 >> auVar133;
  iVar121 = auVar16._0_4_ + iVar9 >> auVar133;
  iVar125 = auVar16._4_4_ + iVar9 >> auVar133;
  iVar31 = auVar16._8_4_ + iVar9 >> auVar133;
  iVar32 = auVar16._12_4_ + iVar9 >> auVar133;
  iVar8 = auVar78._0_4_ + iVar9 >> auVar133;
  iVar65 = auVar78._4_4_ + iVar9 >> auVar133;
  iVar186 = auVar78._8_4_ + iVar9 >> auVar133;
  iVar34 = auVar78._12_4_ + iVar9 >> auVar133;
  iVar168 = auVar48._0_4_ + iVar9 >> auVar133;
  iVar176 = auVar48._4_4_ + iVar9 >> auVar133;
  iVar178 = auVar48._8_4_ + iVar9 >> auVar133;
  iVar5 = auVar48._12_4_ + iVar9 >> auVar133;
  iVar110 = iVar8 + iVar121;
  iVar123 = iVar65 + iVar125;
  iVar149 = iVar186 + iVar31;
  iVar163 = iVar34 + iVar32;
  iVar121 = iVar121 - iVar8;
  iVar125 = iVar125 - iVar65;
  iVar31 = iVar31 - iVar186;
  iVar32 = iVar32 - iVar34;
  iVar119 = iVar168 + iVar136;
  iVar127 = iVar176 + iVar41;
  iVar161 = iVar178 + iVar2;
  iVar165 = iVar5 + iVar10;
  iVar136 = iVar136 - iVar168;
  iVar41 = iVar41 - iVar176;
  iVar2 = iVar2 - iVar178;
  iVar10 = iVar10 - iVar5;
  auVar100._4_4_ = iVar184;
  auVar100._0_4_ = iVar184;
  auVar100._8_4_ = iVar184;
  auVar100._12_4_ = iVar184;
  auVar101._4_4_ = iVar6;
  auVar101._0_4_ = iVar6;
  auVar101._8_4_ = iVar6;
  auVar101._12_4_ = iVar6;
  uVar220 = (uint)(iVar109 < local_248) * local_248 | (uint)(iVar109 >= local_248) * iVar109;
  uVar232 = (uint)(iVar50 < local_248) * local_248 | (uint)(iVar50 >= local_248) * iVar50;
  uVar237 = (uint)(iVar59 < local_248) * local_248 | (uint)(iVar59 >= local_248) * iVar59;
  uVar242 = (uint)(iVar68 < local_248) * local_248 | (uint)(iVar68 >= local_248) * iVar68;
  auVar192._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar192._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar192._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar192._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar122 < local_248) * local_248 | (uint)(iVar122 >= local_248) * iVar122;
  uVar232 = (uint)(iVar52 < local_248) * local_248 | (uint)(iVar52 >= local_248) * iVar52;
  uVar237 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar242 = (uint)(iVar70 < local_248) * local_248 | (uint)(iVar70 >= local_248) * iVar70;
  auVar155._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar155._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar155._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar155._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  auVar78 = pmulld(auVar192,auVar101);
  auVar17 = pmulld(auVar155,auVar100);
  auVar143._4_4_ = iVar185;
  auVar143._0_4_ = iVar185;
  auVar143._8_4_ = iVar185;
  auVar143._12_4_ = iVar185;
  auVar203 = pmulld(auVar192,auVar100);
  auVar79 = pmulld(auVar155,auVar143);
  auVar113._4_4_ = iVar4;
  auVar113._0_4_ = iVar4;
  auVar113._8_4_ = iVar4;
  auVar113._12_4_ = iVar4;
  uVar220 = (uint)(iVar135 < local_248) * local_248 | (uint)(iVar135 >= local_248) * iVar135;
  uVar232 = (uint)(iVar146 < local_248) * local_248 | (uint)(iVar146 >= local_248) * iVar146;
  uVar237 = (uint)(iVar147 < local_248) * local_248 | (uint)(iVar147 >= local_248) * iVar147;
  uVar242 = (uint)(iVar148 < local_248) * local_248 | (uint)(iVar148 >= local_248) * iVar148;
  auVar134._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar134._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar134._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar134._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar76 < local_248) * local_248 | (uint)(iVar76 >= local_248) * iVar76;
  uVar232 = (uint)(iVar85 < local_248) * local_248 | (uint)(iVar85 >= local_248) * iVar85;
  uVar237 = (uint)(iVar90 < local_248) * local_248 | (uint)(iVar90 >= local_248) * iVar90;
  uVar242 = (uint)(iVar95 < local_248) * local_248 | (uint)(iVar95 >= local_248) * iVar95;
  auVar173._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar173._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar173._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar173._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  auVar132 = pmulld(auVar134,auVar113);
  auVar16 = pmulld(auVar173,auVar101);
  auVar48 = pmulld(auVar134,auVar101);
  auVar152 = pmulld(auVar173,auVar100);
  uVar220 = (uint)(iVar12 < local_248) * local_248 | (uint)(iVar12 >= local_248) * iVar12;
  uVar232 = (uint)(iVar7 < local_248) * local_248 | (uint)(iVar7 >= local_248) * iVar7;
  uVar237 = (uint)(iVar22 < local_248) * local_248 | (uint)(iVar22 >= local_248) * iVar22;
  uVar242 = (uint)(iVar25 < local_248) * local_248 | (uint)(iVar25 >= local_248) * iVar25;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar97 = (uint)(iVar30 < local_248) * local_248 | (uint)(iVar30 >= local_248) * iVar30;
  uVar103 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar105 = (uint)(iVar23 < local_248) * local_248 | (uint)(iVar23 >= local_248) * iVar23;
  uVar107 = (uint)(iVar26 < local_248) * local_248 | (uint)(iVar26 >= local_248) * iVar26;
  uVar97 = (uint)(local_258 < (int)uVar97) * local_258 | (local_258 >= (int)uVar97) * uVar97;
  uVar103 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar105 = (uint)(local_258 < (int)uVar105) * local_258 | (local_258 >= (int)uVar105) * uVar105;
  uVar107 = (uint)(local_258 < (int)uVar107) * local_258 | (local_258 >= (int)uVar107) * uVar107;
  iVar176 = auVar115._0_4_ + iVar9 + auVar19._0_4_ >> auVar133;
  iVar30 = auVar115._4_4_ + iVar9 + auVar19._4_4_ >> auVar133;
  iVar5 = auVar115._8_4_ + iVar9 + auVar19._8_4_ >> auVar133;
  iVar65 = auVar115._12_4_ + iVar9 + auVar19._12_4_ >> auVar133;
  iVar178 = auVar182._0_4_ + iVar9 + auVar189._0_4_ >> auVar133;
  iVar184 = auVar182._4_4_ + iVar9 + auVar189._4_4_ >> auVar133;
  iVar185 = auVar182._8_4_ + iVar9 + auVar189._8_4_ >> auVar133;
  iVar6 = auVar182._12_4_ + iVar9 + auVar189._12_4_ >> auVar133;
  iVar179 = uVar97 + uVar220;
  iVar205 = uVar103 + uVar232;
  iVar207 = uVar105 + uVar237;
  iVar236 = uVar107 + uVar242;
  iVar168 = uVar220 - uVar97;
  iVar12 = uVar232 - uVar103;
  iVar4 = uVar237 - uVar105;
  iVar20 = uVar242 - uVar107;
  iVar90 = iVar178 + iVar176;
  iVar135 = iVar184 + iVar30;
  iVar147 = iVar185 + iVar5;
  iVar167 = iVar6 + iVar65;
  iVar176 = iVar176 - iVar178;
  iVar30 = iVar30 - iVar184;
  iVar5 = iVar5 - iVar185;
  iVar65 = iVar65 - iVar6;
  uVar220 = (uint)(iVar33 < local_248) * local_248 | (uint)(iVar33 >= local_248) * iVar33;
  uVar232 = (uint)(iVar21 < local_248) * local_248 | (uint)(iVar21 >= local_248) * iVar21;
  uVar237 = (uint)(iVar24 < local_248) * local_248 | (uint)(iVar24 >= local_248) * iVar24;
  uVar242 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uVar97 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar103 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar105 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar107 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar36 < local_248) * local_248 | (uint)(iVar36 >= local_248) * iVar36;
  uVar232 = (uint)(iVar82 < local_248) * local_248 | (uint)(iVar82 >= local_248) * iVar82;
  uVar237 = (uint)(iVar87 < local_248) * local_248 | (uint)(iVar87 >= local_248) * iVar87;
  uVar242 = (uint)(iVar28 < local_248) * local_248 | (uint)(iVar28 >= local_248) * iVar28;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  iVar184 = auVar18._0_4_ + iVar9 + auVar225._0_4_ >> auVar133;
  iVar185 = auVar18._4_4_ + iVar9 + auVar225._4_4_ >> auVar133;
  iVar36 = auVar18._8_4_ + iVar9 + auVar225._8_4_ >> auVar133;
  iVar7 = auVar18._12_4_ + iVar9 + auVar225._12_4_ >> auVar133;
  iVar201 = uVar220 + uVar97;
  iVar206 = uVar232 + uVar103;
  iVar219 = uVar237 + uVar105;
  iVar241 = uVar242 + uVar107;
  iVar178 = uVar220 - uVar97;
  iVar33 = uVar232 - uVar103;
  iVar6 = uVar237 - uVar105;
  iVar21 = uVar242 - uVar107;
  iVar221 = auVar229._0_4_ + iVar9 + auVar141._0_4_ >> auVar133;
  iVar233 = auVar229._4_4_ + iVar9 + auVar141._4_4_ >> auVar133;
  iVar238 = auVar229._8_4_ + iVar9 + auVar141._8_4_ >> auVar133;
  iVar243 = auVar229._12_4_ + iVar9 + auVar141._12_4_ >> auVar133;
  iVar95 = iVar221 + iVar184;
  iVar146 = iVar233 + iVar185;
  iVar148 = iVar238 + iVar36;
  iVar175 = iVar243 + iVar7;
  iVar221 = iVar221 - iVar184;
  iVar233 = iVar233 - iVar185;
  iVar238 = iVar238 - iVar36;
  iVar243 = iVar243 - iVar7;
  uVar220 = (uint)(iVar40 < local_248) * local_248 | (uint)(iVar40 >= local_248) * iVar40;
  uVar232 = (uint)(iVar56 < local_248) * local_248 | (uint)(iVar56 >= local_248) * iVar56;
  uVar242 = (uint)(iVar92 < local_248) * local_248 | (uint)(iVar92 >= local_248) * iVar92;
  uVar103 = (uint)(iVar29 < local_248) * local_248 | (uint)(iVar29 >= local_248) * iVar29;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar237 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar97 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar105 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar232 = (uint)(iVar74 < local_248) * local_248 | (uint)(iVar74 >= local_248) * iVar74;
  uVar242 = (uint)(iVar83 < local_248) * local_248 | (uint)(iVar83 >= local_248) * iVar83;
  uVar103 = (uint)(iVar88 < local_248) * local_248 | (uint)(iVar88 >= local_248) * iVar88;
  uVar107 = (uint)(iVar93 < local_248) * local_248 | (uint)(iVar93 >= local_248) * iVar93;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar103 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar107 = (uint)(local_258 < (int)uVar107) * local_258 | (local_258 >= (int)uVar107) * uVar107;
  iVar185 = auVar15._0_4_ + iVar9 + auVar139._0_4_ >> auVar133;
  iVar40 = auVar15._4_4_ + iVar9 + auVar139._4_4_ >> auVar133;
  iVar8 = auVar15._8_4_ + iVar9 + auVar139._8_4_ >> auVar133;
  iVar56 = auVar15._12_4_ + iVar9 + auVar139._12_4_ >> auVar133;
  iVar85 = auVar215._0_4_ + iVar9 + auVar170._0_4_ >> auVar133;
  iVar88 = auVar215._4_4_ + iVar9 + auVar170._4_4_ >> auVar133;
  iVar93 = auVar215._8_4_ + iVar9 + auVar170._8_4_ >> auVar133;
  iVar177 = auVar215._12_4_ + iVar9 + auVar170._12_4_ >> auVar133;
  iVar197 = uVar220 + uVar232;
  iVar43 = uVar237 + uVar242;
  iVar50 = uVar97 + uVar103;
  iVar59 = uVar105 + uVar107;
  iVar184 = uVar220 - uVar232;
  iVar36 = uVar237 - uVar242;
  iVar7 = uVar97 - uVar103;
  iVar82 = uVar105 - uVar107;
  iVar37 = iVar85 + iVar185;
  iVar44 = iVar88 + iVar40;
  iVar52 = iVar93 + iVar8;
  iVar61 = iVar177 + iVar56;
  iVar85 = iVar85 - iVar185;
  iVar88 = iVar88 - iVar40;
  iVar93 = iVar93 - iVar8;
  iVar177 = iVar177 - iVar56;
  uVar220 = (uint)(iVar75 < local_248) * local_248 | (uint)(iVar75 >= local_248) * iVar75;
  uVar232 = (uint)(iVar84 < local_248) * local_248 | (uint)(iVar84 >= local_248) * iVar84;
  uVar237 = (uint)(iVar89 < local_248) * local_248 | (uint)(iVar89 >= local_248) * iVar89;
  uVar242 = (uint)(iVar94 < local_248) * local_248 | (uint)(iVar94 >= local_248) * iVar94;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar97 = (uint)(iVar45 < local_248) * local_248 | (uint)(iVar45 >= local_248) * iVar45;
  uVar103 = (uint)(iVar49 < local_248) * local_248 | (uint)(iVar49 >= local_248) * iVar49;
  uVar105 = (uint)(iVar58 < local_248) * local_248 | (uint)(iVar58 >= local_248) * iVar58;
  uVar107 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar97 = (uint)(local_258 < (int)uVar97) * local_258 | (local_258 >= (int)uVar97) * uVar97;
  uVar103 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar105 = (uint)(local_258 < (int)uVar105) * local_258 | (local_258 >= (int)uVar105) * uVar105;
  uVar107 = (uint)(local_258 < (int)uVar107) * local_258 | (local_258 >= (int)uVar107) * uVar107;
  iVar185 = auVar13._0_4_ + iVar9 + auVar227._0_4_ >> auVar133;
  iVar40 = auVar13._4_4_ + iVar9 + auVar227._4_4_ >> auVar133;
  iVar8 = auVar13._8_4_ + iVar9 + auVar227._8_4_ >> auVar133;
  iVar56 = auVar13._12_4_ + iVar9 + auVar227._12_4_ >> auVar133;
  iVar38 = uVar220 + uVar97;
  iVar45 = uVar232 + uVar103;
  iVar49 = uVar237 + uVar105;
  iVar67 = uVar242 + uVar107;
  iVar92 = uVar97 - uVar220;
  iVar25 = uVar103 - uVar232;
  iVar26 = uVar105 - uVar237;
  iVar27 = uVar107 - uVar242;
  iVar22 = auVar14._0_4_ + iVar9 + auVar130._0_4_ >> auVar133;
  iVar23 = auVar14._4_4_ + iVar9 + auVar130._4_4_ >> auVar133;
  iVar24 = auVar14._8_4_ + iVar9 + auVar130._8_4_ >> auVar133;
  iVar87 = auVar14._12_4_ + iVar9 + auVar130._12_4_ >> auVar133;
  iVar39 = iVar22 + iVar185;
  iVar109 = iVar23 + iVar40;
  iVar58 = iVar24 + iVar8;
  iVar68 = iVar87 + iVar56;
  iVar185 = iVar185 - iVar22;
  iVar40 = iVar40 - iVar23;
  iVar8 = iVar8 - iVar24;
  iVar56 = iVar56 - iVar87;
  auVar227._4_4_ = iVar137;
  auVar227._0_4_ = iVar137;
  auVar227._8_4_ = iVar137;
  auVar227._12_4_ = iVar137;
  auVar13 = pmulld((undefined1  [16])*in,auVar227);
  iVar222 = auVar13._0_4_ + iVar9 >> auVar133;
  iVar234 = auVar13._4_4_ + iVar9 >> auVar133;
  iVar239 = auVar13._8_4_ + iVar9 >> auVar133;
  iVar244 = auVar13._12_4_ + iVar9 >> auVar133;
  uVar220 = (uint)(iVar92 < local_248) * local_248 | (uint)(iVar92 >= local_248) * iVar92;
  uVar232 = (uint)(iVar25 < local_248) * local_248 | (uint)(iVar25 >= local_248) * iVar25;
  uVar237 = (uint)(iVar26 < local_248) * local_248 | (uint)(iVar26 >= local_248) * iVar26;
  uVar242 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  auVar183._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar183._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar183._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar183._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar185 < local_248) * local_248 | (uint)(iVar185 >= local_248) * iVar185;
  uVar232 = (uint)(iVar40 < local_248) * local_248 | (uint)(iVar40 >= local_248) * iVar40;
  uVar237 = (uint)(iVar8 < local_248) * local_248 | (uint)(iVar8 >= local_248) * iVar8;
  uVar242 = (uint)(iVar56 < local_248) * local_248 | (uint)(iVar56 >= local_248) * iVar56;
  auVar217._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar217._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar217._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar217._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  auVar215 = pmulld(auVar217,auVar143);
  auVar170 = pmulld(auVar183,auVar143);
  auVar13 = pmulld(auVar143,(undefined1  [16])in[8]);
  iVar122 = auVar13._0_4_ + iVar9 >> auVar133;
  iVar70 = auVar13._4_4_ + iVar9 >> auVar133;
  iVar74 = auVar13._8_4_ + iVar9 >> auVar133;
  iVar75 = auVar13._12_4_ + iVar9 >> auVar133;
  auVar13 = pmulld((undefined1  [16])in[8],auVar100);
  iVar137 = auVar13._0_4_ + iVar9 >> auVar133;
  iVar40 = auVar13._4_4_ + iVar9 >> auVar133;
  iVar8 = auVar13._8_4_ + iVar9 >> auVar133;
  iVar22 = auVar13._12_4_ + iVar9 >> auVar133;
  iVar56 = iVar222 - iVar122;
  iVar24 = iVar234 - iVar70;
  iVar26 = iVar239 - iVar74;
  iVar186 = iVar244 - iVar75;
  iVar122 = iVar122 + iVar222;
  iVar70 = iVar70 + iVar234;
  iVar74 = iVar74 + iVar239;
  iVar75 = iVar75 + iVar244;
  iVar185 = iVar137 + iVar222;
  iVar23 = iVar40 + iVar234;
  iVar27 = iVar8 + iVar239;
  iVar34 = iVar22 + iVar244;
  iVar222 = iVar222 - iVar137;
  iVar234 = iVar234 - iVar40;
  iVar239 = iVar239 - iVar8;
  iVar244 = iVar244 - iVar22;
  auVar144._4_4_ = iVar3;
  auVar144._0_4_ = iVar3;
  auVar144._8_4_ = iVar3;
  auVar144._12_4_ = iVar3;
  uVar220 = (uint)(iVar121 < local_248) * local_248 | (uint)(iVar121 >= local_248) * iVar121;
  uVar232 = (uint)(iVar125 < local_248) * local_248 | (uint)(iVar125 >= local_248) * iVar125;
  uVar237 = (uint)(iVar31 < local_248) * local_248 | (uint)(iVar31 >= local_248) * iVar31;
  uVar242 = (uint)(iVar32 < local_248) * local_248 | (uint)(iVar32 >= local_248) * iVar32;
  auVar189._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar189._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar189._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar189._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar41 < local_248) * local_248 | (uint)(iVar41 >= local_248) * iVar41;
  uVar237 = (uint)(iVar2 < local_248) * local_248 | (uint)(iVar2 >= local_248) * iVar2;
  uVar242 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  auVar156._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar156._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar156._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar156._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  auVar157._0_4_ = auVar156._0_4_ + auVar189._0_4_;
  auVar157._4_4_ = auVar156._4_4_ + auVar189._4_4_;
  auVar157._8_4_ = auVar156._8_4_ + auVar189._8_4_;
  auVar157._12_4_ = auVar156._12_4_ + auVar189._12_4_;
  auVar19 = pmulld(auVar189,auVar144);
  auVar139 = pmulld(auVar156,auVar227);
  uVar220 = (uint)(iVar118 < local_248) * local_248 | (uint)(iVar118 >= local_248) * iVar118;
  uVar232 = (uint)(iVar51 < local_248) * local_248 | (uint)(iVar51 >= local_248) * iVar51;
  uVar237 = (uint)(iVar60 < local_248) * local_248 | (uint)(iVar60 >= local_248) * iVar60;
  uVar242 = (uint)(iVar69 < local_248) * local_248 | (uint)(iVar69 >= local_248) * iVar69;
  uVar97 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar103 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar105 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar107 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar126 < local_248) * local_248 | (uint)(iVar126 >= local_248) * iVar126;
  uVar232 = (uint)(iVar53 < local_248) * local_248 | (uint)(iVar53 >= local_248) * iVar53;
  uVar237 = (uint)(iVar62 < local_248) * local_248 | (uint)(iVar62 >= local_248) * iVar62;
  uVar242 = (uint)(iVar71 < local_248) * local_248 | (uint)(iVar71 >= local_248) * iVar71;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  iVar71 = uVar220 + uVar97;
  iVar76 = uVar232 + uVar103;
  iVar83 = uVar237 + uVar105;
  iVar84 = uVar242 + uVar107;
  iVar42 = uVar97 - uVar220;
  iVar118 = uVar103 - uVar232;
  iVar126 = uVar105 - uVar237;
  iVar53 = uVar107 - uVar242;
  iVar89 = auVar17._0_4_ + iVar9 + auVar78._0_4_ >> auVar133;
  iVar94 = auVar17._4_4_ + iVar9 + auVar78._4_4_ >> auVar133;
  iVar231 = auVar17._8_4_ + iVar9 + auVar78._8_4_ >> auVar133;
  iVar180 = auVar17._12_4_ + iVar9 + auVar78._12_4_ >> auVar133;
  iVar136 = auVar16._0_4_ + iVar9 + auVar132._0_4_ >> auVar133;
  iVar137 = auVar16._4_4_ + iVar9 + auVar132._4_4_ >> auVar133;
  iVar40 = auVar16._8_4_ + iVar9 + auVar132._8_4_ >> auVar133;
  iVar41 = auVar16._12_4_ + iVar9 + auVar132._12_4_ >> auVar133;
  iVar25 = iVar136 + iVar89;
  iVar28 = iVar137 + iVar94;
  iVar31 = iVar40 + iVar231;
  iVar35 = iVar41 + iVar180;
  iVar89 = iVar89 - iVar136;
  iVar94 = iVar94 - iVar137;
  iVar231 = iVar231 - iVar40;
  iVar180 = iVar180 - iVar41;
  uVar220 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar232 = (uint)(iVar54 < local_248) * local_248 | (uint)(iVar54 >= local_248) * iVar54;
  uVar237 = (uint)(iVar63 < local_248) * local_248 | (uint)(iVar63 >= local_248) * iVar63;
  uVar242 = (uint)(iVar72 < local_248) * local_248 | (uint)(iVar72 >= local_248) * iVar72;
  uVar97 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar103 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar105 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar107 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar195 < local_248) * local_248 | (uint)(iVar195 >= local_248) * iVar195;
  uVar232 = (uint)(iVar199 < local_248) * local_248 | (uint)(iVar199 >= local_248) * iVar199;
  uVar237 = (uint)(iVar57 < local_248) * local_248 | (uint)(iVar57 >= local_248) * iVar57;
  uVar242 = (uint)(iVar66 < local_248) * local_248 | (uint)(iVar66 >= local_248) * iVar66;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  iVar199 = uVar97 + uVar220;
  iVar66 = uVar103 + uVar232;
  iVar46 = uVar105 + uVar237;
  iVar54 = uVar107 + uVar242;
  iVar136 = uVar220 - uVar97;
  iVar87 = uVar232 - uVar103;
  iVar121 = uVar237 - uVar105;
  iVar125 = uVar242 - uVar107;
  iVar3 = auVar79._0_4_ + iVar9 + auVar203._0_4_ >> auVar133;
  iVar92 = auVar79._4_4_ + iVar9 + auVar203._4_4_ >> auVar133;
  iVar29 = auVar79._8_4_ + iVar9 + auVar203._8_4_ >> auVar133;
  iVar32 = auVar79._12_4_ + iVar9 + auVar203._12_4_ >> auVar133;
  iVar41 = auVar152._0_4_ + iVar9 + auVar48._0_4_ >> auVar133;
  iVar2 = auVar152._4_4_ + iVar9 + auVar48._4_4_ >> auVar133;
  iVar10 = auVar152._8_4_ + iVar9 + auVar48._8_4_ >> auVar133;
  iVar195 = auVar152._12_4_ + iVar9 + auVar48._12_4_ >> auVar133;
  iVar137 = iVar41 + iVar3;
  iVar40 = iVar2 + iVar92;
  iVar8 = iVar10 + iVar29;
  iVar22 = iVar195 + iVar32;
  iVar3 = iVar3 - iVar41;
  iVar92 = iVar92 - iVar2;
  iVar29 = iVar29 - iVar10;
  iVar32 = iVar32 - iVar195;
  uVar220 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar232 = (uint)(iVar30 < local_248) * local_248 | (uint)(iVar30 >= local_248) * iVar30;
  uVar237 = (uint)(iVar5 < local_248) * local_248 | (uint)(iVar5 >= local_248) * iVar5;
  uVar242 = (uint)(iVar65 < local_248) * local_248 | (uint)(iVar65 >= local_248) * iVar65;
  auVar203._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar203._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar203._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar203._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  auVar17 = pmulld(auVar203,auVar101);
  auVar152 = pmulld(auVar217,auVar100);
  auVar48 = pmulld(auVar203,auVar100);
  uVar220 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar232 = (uint)(iVar12 < local_248) * local_248 | (uint)(iVar12 >= local_248) * iVar12;
  uVar237 = (uint)(iVar4 < local_248) * local_248 | (uint)(iVar4 >= local_248) * iVar4;
  uVar242 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  auVar115._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar115._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar115._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar115._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  auVar78 = pmulld(auVar115,auVar101);
  auVar182 = pmulld(auVar183,auVar100);
  auVar13 = pmulld(auVar115,auVar100);
  uVar220 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  uVar232 = (uint)(iVar33 < local_248) * local_248 | (uint)(iVar33 >= local_248) * iVar33;
  uVar237 = (uint)(iVar6 < local_248) * local_248 | (uint)(iVar6 >= local_248) * iVar6;
  uVar242 = (uint)(iVar21 < local_248) * local_248 | (uint)(iVar21 >= local_248) * iVar21;
  auVar130._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar130._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar130._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar130._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar184 < local_248) * local_248 | (uint)(iVar184 >= local_248) * iVar184;
  uVar232 = (uint)(iVar36 < local_248) * local_248 | (uint)(iVar36 >= local_248) * iVar36;
  uVar237 = (uint)(iVar7 < local_248) * local_248 | (uint)(iVar7 >= local_248) * iVar7;
  uVar242 = (uint)(iVar82 < local_248) * local_248 | (uint)(iVar82 >= local_248) * iVar82;
  auVar145._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar145._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar145._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar145._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  auVar79 = pmulld(auVar130,auVar113);
  auVar189 = pmulld(auVar145,auVar101);
  auVar14 = pmulld(auVar130,auVar101);
  auVar130 = pmulld(auVar145,auVar100);
  uVar220 = (uint)(iVar221 < local_248) * local_248 | (uint)(iVar221 >= local_248) * iVar221;
  uVar232 = (uint)(iVar233 < local_248) * local_248 | (uint)(iVar233 >= local_248) * iVar233;
  uVar237 = (uint)(iVar238 < local_248) * local_248 | (uint)(iVar238 >= local_248) * iVar238;
  uVar242 = (uint)(iVar243 < local_248) * local_248 | (uint)(iVar243 >= local_248) * iVar243;
  auVar132._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar132._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar132._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar132._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar85 < local_248) * local_248 | (uint)(iVar85 >= local_248) * iVar85;
  uVar232 = (uint)(iVar88 < local_248) * local_248 | (uint)(iVar88 >= local_248) * iVar88;
  uVar237 = (uint)(iVar93 < local_248) * local_248 | (uint)(iVar93 >= local_248) * iVar93;
  uVar242 = (uint)(iVar177 < local_248) * local_248 | (uint)(iVar177 >= local_248) * iVar177;
  auVar141._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar141._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar141._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar141._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  auVar115 = pmulld(auVar113,auVar132);
  auVar113 = pmulld(auVar141,auVar101);
  auVar15 = pmulld(auVar132,auVar101);
  auVar18 = pmulld(auVar141,auVar100);
  uVar220 = (uint)(iVar119 < local_248) * local_248 | (uint)(iVar119 >= local_248) * iVar119;
  uVar232 = (uint)(iVar127 < local_248) * local_248 | (uint)(iVar127 >= local_248) * iVar127;
  uVar237 = (uint)(iVar161 < local_248) * local_248 | (uint)(iVar161 >= local_248) * iVar161;
  uVar242 = (uint)(iVar165 < local_248) * local_248 | (uint)(iVar165 >= local_248) * iVar165;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar97 = (uint)(iVar122 < local_248) * local_248 | (uint)(iVar122 >= local_248) * iVar122;
  uVar103 = (uint)(iVar70 < local_248) * local_248 | (uint)(iVar70 >= local_248) * iVar70;
  uVar105 = (uint)(iVar74 < local_248) * local_248 | (uint)(iVar74 >= local_248) * iVar74;
  uVar107 = (uint)(iVar75 < local_248) * local_248 | (uint)(iVar75 >= local_248) * iVar75;
  uVar97 = (uint)(local_258 < (int)uVar97) * local_258 | (local_258 >= (int)uVar97) * uVar97;
  uVar103 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar105 = (uint)(local_258 < (int)uVar105) * local_258 | (local_258 >= (int)uVar105) * uVar105;
  uVar107 = (uint)(local_258 < (int)uVar107) * local_258 | (local_258 >= (int)uVar107) * uVar107;
  iVar233 = uVar97 + uVar220;
  iVar238 = uVar103 + uVar232;
  iVar243 = uVar105 + uVar237;
  iVar218 = uVar107 + uVar242;
  iVar184 = uVar97 - uVar220;
  iVar41 = uVar103 - uVar232;
  iVar7 = uVar105 - uVar237;
  iVar65 = uVar107 - uVar242;
  uVar220 = (uint)(iVar185 < local_248) * local_248 | (uint)(iVar185 >= local_248) * iVar185;
  uVar232 = (uint)(iVar23 < local_248) * local_248 | (uint)(iVar23 >= local_248) * iVar23;
  uVar237 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uVar242 = (uint)(iVar34 < local_248) * local_248 | (uint)(iVar34 >= local_248) * iVar34;
  auVar16 = pmulld(auVar157,auVar227);
  iVar185 = auVar16._0_4_ + iVar9 >> auVar133;
  iVar2 = auVar16._4_4_ + iVar9 >> auVar133;
  iVar10 = auVar16._8_4_ + iVar9 >> auVar133;
  iVar23 = auVar16._12_4_ + iVar9 >> auVar133;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  iVar72 = iVar185 + uVar220;
  iVar74 = iVar2 + uVar232;
  iVar75 = iVar10 + uVar237;
  iVar85 = iVar23 + uVar242;
  iVar185 = uVar220 - iVar185;
  iVar2 = uVar232 - iVar2;
  iVar10 = uVar237 - iVar10;
  iVar23 = uVar242 - iVar23;
  uVar220 = (uint)(iVar222 < local_248) * local_248 | (uint)(iVar222 >= local_248) * iVar222;
  uVar232 = (uint)(iVar234 < local_248) * local_248 | (uint)(iVar234 >= local_248) * iVar234;
  uVar237 = (uint)(iVar239 < local_248) * local_248 | (uint)(iVar239 >= local_248) * iVar239;
  uVar242 = (uint)(iVar244 < local_248) * local_248 | (uint)(iVar244 >= local_248) * iVar244;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  iVar161 = auVar139._0_4_ + iVar9 + auVar19._0_4_ >> auVar133;
  iVar165 = auVar139._4_4_ + iVar9 + auVar19._4_4_ >> auVar133;
  iVar177 = auVar139._8_4_ + iVar9 + auVar19._8_4_ >> auVar133;
  iVar221 = auVar139._12_4_ + iVar9 + auVar19._12_4_ >> auVar133;
  iVar88 = iVar161 + uVar220;
  iVar93 = iVar165 + uVar232;
  iVar119 = iVar177 + uVar237;
  iVar127 = iVar221 + uVar242;
  iVar161 = uVar220 - iVar161;
  iVar165 = uVar232 - iVar165;
  iVar177 = uVar237 - iVar177;
  iVar221 = uVar242 - iVar221;
  uVar220 = (uint)(iVar110 < local_248) * local_248 | (uint)(iVar110 >= local_248) * iVar110;
  uVar232 = (uint)(iVar123 < local_248) * local_248 | (uint)(iVar123 >= local_248) * iVar123;
  uVar237 = (uint)(iVar149 < local_248) * local_248 | (uint)(iVar149 >= local_248) * iVar149;
  uVar242 = (uint)(iVar163 < local_248) * local_248 | (uint)(iVar163 >= local_248) * iVar163;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar97 = (uint)(iVar56 < local_248) * local_248 | (uint)(iVar56 >= local_248) * iVar56;
  uVar103 = (uint)(iVar24 < local_248) * local_248 | (uint)(iVar24 >= local_248) * iVar24;
  uVar105 = (uint)(iVar26 < local_248) * local_248 | (uint)(iVar26 >= local_248) * iVar26;
  uVar107 = (uint)(iVar186 < local_248) * local_248 | (uint)(iVar186 >= local_248) * iVar186;
  uVar97 = (uint)(local_258 < (int)uVar97) * local_258 | (local_258 >= (int)uVar97) * uVar97;
  uVar103 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar105 = (uint)(local_258 < (int)uVar105) * local_258 | (local_258 >= (int)uVar105) * uVar105;
  uVar107 = (uint)(local_258 < (int)uVar107) * local_258 | (local_258 >= (int)uVar107) * uVar107;
  iVar62 = uVar97 + uVar220;
  iVar63 = uVar103 + uVar232;
  iVar69 = uVar105 + uVar237;
  iVar70 = uVar107 + uVar242;
  iVar57 = uVar97 - uVar220;
  iVar122 = uVar103 - uVar232;
  iVar51 = uVar105 - uVar237;
  iVar60 = uVar107 - uVar242;
  uVar220 = (uint)(iVar89 < local_248) * local_248 | (uint)(iVar89 >= local_248) * iVar89;
  uVar232 = (uint)(iVar94 < local_248) * local_248 | (uint)(iVar94 >= local_248) * iVar94;
  uVar237 = (uint)(iVar231 < local_248) * local_248 | (uint)(iVar231 >= local_248) * iVar231;
  uVar242 = (uint)(iVar180 < local_248) * local_248 | (uint)(iVar180 >= local_248) * iVar180;
  auVar174._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar174._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar174._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar174._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar3 < local_248) * local_248 | (uint)(iVar3 >= local_248) * iVar3;
  uVar232 = (uint)(iVar92 < local_248) * local_248 | (uint)(iVar92 >= local_248) * iVar92;
  uVar237 = (uint)(iVar29 < local_248) * local_248 | (uint)(iVar29 >= local_248) * iVar29;
  uVar242 = (uint)(iVar32 < local_248) * local_248 | (uint)(iVar32 >= local_248) * iVar32;
  auVar229._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar229._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar229._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar229._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  auVar80._0_4_ = auVar229._0_4_ + auVar174._0_4_;
  auVar80._4_4_ = auVar229._4_4_ + auVar174._4_4_;
  auVar80._8_4_ = auVar229._8_4_ + auVar174._8_4_;
  auVar80._12_4_ = auVar229._12_4_ + auVar174._12_4_;
  auVar19 = pmulld(auVar174,auVar144);
  auVar100 = pmulld(auVar229,auVar227);
  uVar220 = (uint)(iVar42 < local_248) * local_248 | (uint)(iVar42 >= local_248) * iVar42;
  uVar232 = (uint)(iVar118 < local_248) * local_248 | (uint)(iVar118 >= local_248) * iVar118;
  uVar237 = (uint)(iVar126 < local_248) * local_248 | (uint)(iVar126 >= local_248) * iVar126;
  uVar242 = (uint)(iVar53 < local_248) * local_248 | (uint)(iVar53 >= local_248) * iVar53;
  auVar158._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar158._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar158._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar158._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar87 < local_248) * local_248 | (uint)(iVar87 >= local_248) * iVar87;
  uVar237 = (uint)(iVar121 < local_248) * local_248 | (uint)(iVar121 >= local_248) * iVar121;
  uVar242 = (uint)(iVar125 < local_248) * local_248 | (uint)(iVar125 >= local_248) * iVar125;
  auVar139._0_4_ =
       (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  auVar139._4_4_ =
       (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  auVar139._8_4_ =
       (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  auVar139._12_4_ =
       (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  local_448._4_4_ = auVar139._4_4_ + auVar158._4_4_;
  local_448._0_4_ = auVar139._0_4_ + auVar158._0_4_;
  local_448._8_4_ = auVar139._8_4_ + auVar158._8_4_;
  local_448._12_4_ = auVar139._12_4_ + auVar158._12_4_;
  auVar16 = pmulld(auVar158,auVar144);
  auVar132 = pmulld(auVar139,auVar227);
  uVar220 = (uint)(iVar179 < local_248) * local_248 | (uint)(iVar179 >= local_248) * iVar179;
  uVar232 = (uint)(iVar205 < local_248) * local_248 | (uint)(iVar205 >= local_248) * iVar205;
  uVar237 = (uint)(iVar207 < local_248) * local_248 | (uint)(iVar207 >= local_248) * iVar207;
  uVar242 = (uint)(iVar236 < local_248) * local_248 | (uint)(iVar236 >= local_248) * iVar236;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar97 = (uint)(iVar201 < local_248) * local_248 | (uint)(iVar201 >= local_248) * iVar201;
  uVar103 = (uint)(iVar206 < local_248) * local_248 | (uint)(iVar206 >= local_248) * iVar206;
  uVar105 = (uint)(iVar219 < local_248) * local_248 | (uint)(iVar219 >= local_248) * iVar219;
  uVar107 = (uint)(iVar241 < local_248) * local_248 | (uint)(iVar241 >= local_248) * iVar241;
  uVar97 = (uint)(local_258 < (int)uVar97) * local_258 | (local_258 >= (int)uVar97) * uVar97;
  uVar103 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar105 = (uint)(local_258 < (int)uVar105) * local_258 | (local_258 >= (int)uVar105) * uVar105;
  uVar107 = (uint)(local_258 < (int)uVar107) * local_258 | (local_258 >= (int)uVar107) * uVar107;
  iVar136 = uVar97 + uVar220;
  iVar168 = uVar103 + uVar232;
  iVar176 = uVar105 + uVar237;
  iVar178 = uVar107 + uVar242;
  iVar42 = uVar220 - uVar97;
  iVar118 = uVar232 - uVar103;
  iVar126 = uVar237 - uVar105;
  iVar53 = uVar242 - uVar107;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  local_138 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_134 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_130 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_12c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar90 < local_248) * local_248 | (uint)(iVar90 >= local_248) * iVar90;
  uVar232 = (uint)(iVar135 < local_248) * local_248 | (uint)(iVar135 >= local_248) * iVar135;
  uVar237 = (uint)(iVar147 < local_248) * local_248 | (uint)(iVar147 >= local_248) * iVar147;
  uVar242 = (uint)(iVar167 < local_248) * local_248 | (uint)(iVar167 >= local_248) * iVar167;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar97 = (uint)(iVar95 < local_248) * local_248 | (uint)(iVar95 >= local_248) * iVar95;
  uVar103 = (uint)(iVar146 < local_248) * local_248 | (uint)(iVar146 >= local_248) * iVar146;
  uVar105 = (uint)(iVar148 < local_248) * local_248 | (uint)(iVar148 >= local_248) * iVar148;
  uVar107 = (uint)(iVar175 < local_248) * local_248 | (uint)(iVar175 >= local_248) * iVar175;
  uVar97 = (uint)(local_258 < (int)uVar97) * local_258 | (local_258 >= (int)uVar97) * uVar97;
  uVar103 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar105 = (uint)(local_258 < (int)uVar105) * local_258 | (local_258 >= (int)uVar105) * uVar105;
  uVar107 = (uint)(local_258 < (int)uVar107) * local_258 | (local_258 >= (int)uVar107) * uVar107;
  iVar136 = uVar97 + uVar220;
  iVar168 = uVar103 + uVar232;
  iVar176 = uVar105 + uVar237;
  iVar178 = uVar107 + uVar242;
  iVar26 = uVar220 - uVar97;
  iVar29 = uVar232 - uVar103;
  iVar32 = uVar237 - uVar105;
  iVar195 = uVar242 - uVar107;
  iVar12 = auVar17._0_4_ + iVar9 + auVar152._0_4_ >> auVar133;
  iVar3 = auVar17._4_4_ + iVar9 + auVar152._4_4_ >> auVar133;
  iVar20 = auVar17._8_4_ + iVar9 + auVar152._8_4_ >> auVar133;
  iVar24 = auVar17._12_4_ + iVar9 + auVar152._12_4_ >> auVar133;
  iVar30 = auVar115._0_4_ + iVar9 + auVar113._0_4_ >> auVar133;
  iVar33 = auVar115._4_4_ + iVar9 + auVar113._4_4_ >> auVar133;
  iVar36 = auVar115._8_4_ + iVar9 + auVar113._8_4_ >> auVar133;
  iVar4 = auVar115._12_4_ + iVar9 + auVar113._12_4_ >> auVar133;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  local_128 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_124 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_120 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_11c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  iVar136 = iVar30 + iVar12;
  iVar168 = iVar33 + iVar3;
  iVar176 = iVar36 + iVar20;
  iVar178 = iVar4 + iVar24;
  iVar12 = iVar12 - iVar30;
  iVar3 = iVar3 - iVar33;
  iVar20 = iVar20 - iVar36;
  iVar24 = iVar24 - iVar4;
  iVar30 = auVar182._0_4_ + iVar9 + auVar78._0_4_ >> auVar133;
  iVar4 = auVar182._4_4_ + iVar9 + auVar78._4_4_ >> auVar133;
  iVar21 = auVar182._8_4_ + iVar9 + auVar78._8_4_ >> auVar133;
  iVar87 = auVar182._12_4_ + iVar9 + auVar78._12_4_ >> auVar133;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  local_118 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_114 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_110 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_10c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  iVar33 = auVar189._0_4_ + iVar9 + auVar79._0_4_ >> auVar133;
  iVar36 = auVar189._4_4_ + iVar9 + auVar79._4_4_ >> auVar133;
  iVar5 = auVar189._8_4_ + iVar9 + auVar79._8_4_ >> auVar133;
  iVar6 = auVar189._12_4_ + iVar9 + auVar79._12_4_ >> auVar133;
  iVar136 = iVar33 + iVar30;
  iVar168 = iVar36 + iVar4;
  iVar176 = iVar5 + iVar21;
  iVar178 = iVar6 + iVar87;
  iVar30 = iVar30 - iVar33;
  iVar4 = iVar4 - iVar36;
  iVar21 = iVar21 - iVar5;
  iVar87 = iVar87 - iVar6;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  local_108 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_104 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_100 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_fc = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar197 < local_248) * local_248 | (uint)(iVar197 >= local_248) * iVar197;
  uVar232 = (uint)(iVar43 < local_248) * local_248 | (uint)(iVar43 >= local_248) * iVar43;
  uVar237 = (uint)(iVar50 < local_248) * local_248 | (uint)(iVar50 >= local_248) * iVar50;
  uVar242 = (uint)(iVar59 < local_248) * local_248 | (uint)(iVar59 >= local_248) * iVar59;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar97 = (uint)(iVar38 < local_248) * local_248 | (uint)(iVar38 >= local_248) * iVar38;
  uVar103 = (uint)(iVar45 < local_248) * local_248 | (uint)(iVar45 >= local_248) * iVar45;
  uVar105 = (uint)(iVar49 < local_248) * local_248 | (uint)(iVar49 >= local_248) * iVar49;
  uVar107 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar97 = (uint)(local_258 < (int)uVar97) * local_258 | (local_258 >= (int)uVar97) * uVar97;
  uVar103 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar105 = (uint)(local_258 < (int)uVar105) * local_258 | (local_258 >= (int)uVar105) * uVar105;
  uVar107 = (uint)(local_258 < (int)uVar107) * local_258 | (local_258 >= (int)uVar107) * uVar107;
  iVar136 = uVar220 + uVar97;
  iVar168 = uVar232 + uVar103;
  iVar176 = uVar237 + uVar105;
  iVar178 = uVar242 + uVar107;
  iVar43 = uVar97 - uVar220;
  iVar45 = uVar103 - uVar232;
  iVar49 = uVar105 - uVar237;
  iVar50 = uVar107 - uVar242;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  local_48 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_44 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_40 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_3c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar37 < local_248) * local_248 | (uint)(iVar37 >= local_248) * iVar37;
  uVar232 = (uint)(iVar44 < local_248) * local_248 | (uint)(iVar44 >= local_248) * iVar44;
  uVar237 = (uint)(iVar52 < local_248) * local_248 | (uint)(iVar52 >= local_248) * iVar52;
  uVar242 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar97 = (uint)(iVar39 < local_248) * local_248 | (uint)(iVar39 >= local_248) * iVar39;
  uVar103 = (uint)(iVar109 < local_248) * local_248 | (uint)(iVar109 >= local_248) * iVar109;
  uVar105 = (uint)(iVar58 < local_248) * local_248 | (uint)(iVar58 >= local_248) * iVar58;
  uVar107 = (uint)(iVar68 < local_248) * local_248 | (uint)(iVar68 >= local_248) * iVar68;
  uVar97 = (uint)(local_258 < (int)uVar97) * local_258 | (local_258 >= (int)uVar97) * uVar97;
  uVar103 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar105 = (uint)(local_258 < (int)uVar105) * local_258 | (local_258 >= (int)uVar105) * uVar105;
  uVar107 = (uint)(local_258 < (int)uVar107) * local_258 | (local_258 >= (int)uVar107) * uVar107;
  iVar136 = uVar220 + uVar97;
  iVar168 = uVar232 + uVar103;
  iVar176 = uVar237 + uVar105;
  iVar178 = uVar242 + uVar107;
  iVar197 = uVar97 - uVar220;
  iVar37 = uVar103 - uVar232;
  iVar38 = uVar105 - uVar237;
  iVar39 = uVar107 - uVar242;
  iVar33 = auVar48._0_4_ + iVar9 + auVar215._0_4_ >> auVar133;
  iVar5 = auVar48._4_4_ + iVar9 + auVar215._4_4_ >> auVar133;
  iVar82 = auVar48._8_4_ + iVar9 + auVar215._8_4_ >> auVar133;
  iVar92 = auVar48._12_4_ + iVar9 + auVar215._12_4_ >> auVar133;
  iVar36 = auVar15._0_4_ + iVar9 + auVar18._0_4_ >> auVar133;
  iVar6 = auVar15._4_4_ + iVar9 + auVar18._4_4_ >> auVar133;
  iVar56 = auVar15._8_4_ + iVar9 + auVar18._8_4_ >> auVar133;
  iVar121 = auVar15._12_4_ + iVar9 + auVar18._12_4_ >> auVar133;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  local_58 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_54 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_50 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_4c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  iVar136 = iVar36 + iVar33;
  iVar168 = iVar6 + iVar5;
  iVar176 = iVar56 + iVar82;
  iVar178 = iVar121 + iVar92;
  iVar33 = iVar33 - iVar36;
  iVar5 = iVar5 - iVar6;
  iVar82 = iVar82 - iVar56;
  iVar92 = iVar92 - iVar121;
  iVar27 = auVar170._0_4_ + iVar9 + auVar13._0_4_ >> auVar133;
  iVar125 = auVar170._4_4_ + iVar9 + auVar13._4_4_ >> auVar133;
  iVar186 = auVar170._8_4_ + iVar9 + auVar13._8_4_ >> auVar133;
  iVar34 = auVar170._12_4_ + iVar9 + auVar13._12_4_ >> auVar133;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  local_68 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_64 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_60 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_5c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  iVar36 = auVar130._0_4_ + iVar9 + auVar14._0_4_ >> auVar133;
  iVar6 = auVar130._4_4_ + iVar9 + auVar14._4_4_ >> auVar133;
  iVar56 = auVar130._8_4_ + iVar9 + auVar14._8_4_ >> auVar133;
  iVar121 = auVar130._12_4_ + iVar9 + auVar14._12_4_ >> auVar133;
  iVar136 = iVar36 + iVar27;
  iVar168 = iVar6 + iVar125;
  iVar176 = iVar56 + iVar186;
  iVar178 = iVar121 + iVar34;
  iVar27 = iVar27 - iVar36;
  iVar125 = iVar125 - iVar6;
  iVar186 = iVar186 - iVar56;
  iVar34 = iVar34 - iVar121;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  local_78 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_74 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_70 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_6c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar199 < local_248) * local_248 | (uint)(iVar199 >= local_248) * iVar199;
  uVar232 = (uint)(iVar66 < local_248) * local_248 | (uint)(iVar66 >= local_248) * iVar66;
  uVar237 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar242 = (uint)(iVar54 < local_248) * local_248 | (uint)(iVar54 >= local_248) * iVar54;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar97 = (uint)(iVar233 < local_248) * local_248 | (uint)(iVar233 >= local_248) * iVar233;
  uVar103 = (uint)(iVar238 < local_248) * local_248 | (uint)(iVar238 >= local_248) * iVar238;
  uVar105 = (uint)(iVar243 < local_248) * local_248 | (uint)(iVar243 >= local_248) * iVar243;
  uVar107 = (uint)(iVar218 < local_248) * local_248 | (uint)(iVar218 >= local_248) * iVar218;
  uVar97 = (uint)(local_258 < (int)uVar97) * local_258 | (local_258 >= (int)uVar97) * uVar97;
  uVar103 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar105 = (uint)(local_258 < (int)uVar105) * local_258 | (local_258 >= (int)uVar105) * uVar105;
  uVar107 = (uint)(local_258 < (int)uVar107) * local_258 | (local_258 >= (int)uVar107) * uVar107;
  iVar136 = uVar220 + uVar97;
  iVar168 = uVar232 + uVar103;
  iVar176 = uVar237 + uVar105;
  iVar178 = uVar242 + uVar107;
  iVar36 = uVar97 - uVar220;
  iVar6 = uVar103 - uVar232;
  iVar56 = uVar105 - uVar237;
  iVar121 = uVar107 - uVar242;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  local_238 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_234 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_230 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_22c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar36 < local_248) * local_248 | (uint)(iVar36 >= local_248) * iVar36;
  uVar232 = (uint)(iVar6 < local_248) * local_248 | (uint)(iVar6 >= local_248) * iVar6;
  uVar237 = (uint)(iVar56 < local_248) * local_248 | (uint)(iVar56 >= local_248) * iVar56;
  uVar242 = (uint)(iVar121 < local_248) * local_248 | (uint)(iVar121 >= local_248) * iVar121;
  local_148 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_144 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_140 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_13c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar137 < local_248) * local_248 | (uint)(iVar137 >= local_248) * iVar137;
  uVar232 = (uint)(iVar40 < local_248) * local_248 | (uint)(iVar40 >= local_248) * iVar40;
  uVar237 = (uint)(iVar8 < local_248) * local_248 | (uint)(iVar8 >= local_248) * iVar8;
  uVar242 = (uint)(iVar22 < local_248) * local_248 | (uint)(iVar22 >= local_248) * iVar22;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar97 = (uint)(iVar72 < local_248) * local_248 | (uint)(iVar72 >= local_248) * iVar72;
  uVar103 = (uint)(iVar74 < local_248) * local_248 | (uint)(iVar74 >= local_248) * iVar74;
  uVar105 = (uint)(iVar75 < local_248) * local_248 | (uint)(iVar75 >= local_248) * iVar75;
  uVar107 = (uint)(iVar85 < local_248) * local_248 | (uint)(iVar85 >= local_248) * iVar85;
  uVar97 = (uint)(local_258 < (int)uVar97) * local_258 | (local_258 >= (int)uVar97) * uVar97;
  uVar103 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar105 = (uint)(local_258 < (int)uVar105) * local_258 | (local_258 >= (int)uVar105) * uVar105;
  uVar107 = (uint)(local_258 < (int)uVar107) * local_258 | (local_258 >= (int)uVar107) * uVar107;
  iVar136 = uVar220 + uVar97;
  iVar168 = uVar232 + uVar103;
  iVar176 = uVar237 + uVar105;
  iVar178 = uVar242 + uVar107;
  iVar137 = uVar97 - uVar220;
  iVar36 = uVar103 - uVar232;
  iVar40 = uVar105 - uVar237;
  iVar6 = uVar107 - uVar242;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  local_228 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_224 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_220 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_21c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar137 < local_248) * local_248 | (uint)(iVar137 >= local_248) * iVar137;
  uVar232 = (uint)(iVar36 < local_248) * local_248 | (uint)(iVar36 >= local_248) * iVar36;
  uVar237 = (uint)(iVar40 < local_248) * local_248 | (uint)(iVar40 >= local_248) * iVar40;
  uVar242 = (uint)(iVar6 < local_248) * local_248 | (uint)(iVar6 >= local_248) * iVar6;
  local_158 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_154 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_150 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_14c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar88 < local_248) * local_248 | (uint)(iVar88 >= local_248) * iVar88;
  uVar232 = (uint)(iVar93 < local_248) * local_248 | (uint)(iVar93 >= local_248) * iVar93;
  uVar237 = (uint)(iVar119 < local_248) * local_248 | (uint)(iVar119 >= local_248) * iVar119;
  uVar242 = (uint)(iVar127 < local_248) * local_248 | (uint)(iVar127 >= local_248) * iVar127;
  auVar13 = pmulld(auVar80,auVar227);
  iVar137 = auVar13._0_4_ + iVar9 >> auVar133;
  iVar36 = auVar13._4_4_ + iVar9 >> auVar133;
  iVar40 = auVar13._8_4_ + iVar9 >> auVar133;
  iVar6 = auVar13._12_4_ + iVar9 >> auVar133;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  iVar136 = iVar137 + uVar220;
  iVar168 = iVar36 + uVar232;
  iVar176 = iVar40 + uVar237;
  iVar178 = iVar6 + uVar242;
  iVar137 = uVar220 - iVar137;
  iVar36 = uVar232 - iVar36;
  iVar40 = uVar237 - iVar40;
  iVar6 = uVar242 - iVar6;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  local_218 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_214 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_210 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_20c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar137 < local_248) * local_248 | (uint)(iVar137 >= local_248) * iVar137;
  uVar232 = (uint)(iVar36 < local_248) * local_248 | (uint)(iVar36 >= local_248) * iVar36;
  uVar237 = (uint)(iVar40 < local_248) * local_248 | (uint)(iVar40 >= local_248) * iVar40;
  uVar242 = (uint)(iVar6 < local_248) * local_248 | (uint)(iVar6 >= local_248) * iVar6;
  local_168 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_164 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_160 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_15c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar62 < local_248) * local_248 | (uint)(iVar62 >= local_248) * iVar62;
  uVar232 = (uint)(iVar63 < local_248) * local_248 | (uint)(iVar63 >= local_248) * iVar63;
  uVar237 = (uint)(iVar69 < local_248) * local_248 | (uint)(iVar69 >= local_248) * iVar69;
  uVar242 = (uint)(iVar70 < local_248) * local_248 | (uint)(iVar70 >= local_248) * iVar70;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  auVar13 = pmulld(local_448,auVar227);
  iVar137 = auVar13._0_4_ + iVar9 >> auVar133;
  iVar36 = auVar13._4_4_ + iVar9 >> auVar133;
  iVar40 = auVar13._8_4_ + iVar9 >> auVar133;
  iVar6 = auVar13._12_4_ + iVar9 >> auVar133;
  iVar136 = iVar137 + uVar220;
  iVar168 = iVar36 + uVar232;
  iVar176 = iVar40 + uVar237;
  iVar178 = iVar6 + uVar242;
  iVar137 = uVar220 - iVar137;
  iVar36 = uVar232 - iVar36;
  iVar40 = uVar237 - iVar40;
  iVar6 = uVar242 - iVar6;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  local_208 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_204 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_200 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_1fc = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar137 < local_248) * local_248 | (uint)(iVar137 >= local_248) * iVar137;
  uVar232 = (uint)(iVar36 < local_248) * local_248 | (uint)(iVar36 >= local_248) * iVar36;
  uVar237 = (uint)(iVar40 < local_248) * local_248 | (uint)(iVar40 >= local_248) * iVar40;
  uVar242 = (uint)(iVar6 < local_248) * local_248 | (uint)(iVar6 >= local_248) * iVar6;
  local_178 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_174 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_170 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_16c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar57 < local_248) * local_248 | (uint)(iVar57 >= local_248) * iVar57;
  uVar232 = (uint)(iVar122 < local_248) * local_248 | (uint)(iVar122 >= local_248) * iVar122;
  uVar237 = (uint)(iVar51 < local_248) * local_248 | (uint)(iVar51 >= local_248) * iVar51;
  uVar242 = (uint)(iVar60 < local_248) * local_248 | (uint)(iVar60 >= local_248) * iVar60;
  iVar137 = auVar132._0_4_ + iVar9 + auVar16._0_4_ >> auVar133;
  iVar36 = auVar132._4_4_ + iVar9 + auVar16._4_4_ >> auVar133;
  iVar40 = auVar132._8_4_ + iVar9 + auVar16._8_4_ >> auVar133;
  iVar6 = auVar132._12_4_ + iVar9 + auVar16._12_4_ >> auVar133;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  iVar136 = iVar137 + uVar220;
  iVar168 = iVar36 + uVar232;
  iVar176 = iVar40 + uVar237;
  iVar178 = iVar6 + uVar242;
  iVar137 = uVar220 - iVar137;
  iVar36 = uVar232 - iVar36;
  iVar40 = uVar237 - iVar40;
  iVar6 = uVar242 - iVar6;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  local_1f8 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_1f4 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_1f0 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_1ec = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar137 < local_248) * local_248 | (uint)(iVar137 >= local_248) * iVar137;
  uVar232 = (uint)(iVar36 < local_248) * local_248 | (uint)(iVar36 >= local_248) * iVar36;
  uVar237 = (uint)(iVar40 < local_248) * local_248 | (uint)(iVar40 >= local_248) * iVar40;
  uVar242 = (uint)(iVar6 < local_248) * local_248 | (uint)(iVar6 >= local_248) * iVar6;
  local_188 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_184 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_180 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_17c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar161 < local_248) * local_248 | (uint)(iVar161 >= local_248) * iVar161;
  uVar232 = (uint)(iVar165 < local_248) * local_248 | (uint)(iVar165 >= local_248) * iVar165;
  uVar237 = (uint)(iVar177 < local_248) * local_248 | (uint)(iVar177 >= local_248) * iVar177;
  uVar242 = (uint)(iVar221 < local_248) * local_248 | (uint)(iVar221 >= local_248) * iVar221;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  iVar137 = auVar19._0_4_ + iVar9 + auVar100._0_4_ >> auVar133;
  iVar36 = auVar19._4_4_ + iVar9 + auVar100._4_4_ >> auVar133;
  iVar40 = auVar19._8_4_ + iVar9 + auVar100._8_4_ >> auVar133;
  iVar6 = auVar19._12_4_ + iVar9 + auVar100._12_4_ >> auVar133;
  iVar136 = iVar137 + uVar220;
  iVar168 = iVar36 + uVar232;
  iVar176 = iVar40 + uVar237;
  iVar178 = iVar6 + uVar242;
  iVar137 = uVar220 - iVar137;
  iVar36 = uVar232 - iVar36;
  iVar40 = uVar237 - iVar40;
  iVar6 = uVar242 - iVar6;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  local_1e8 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_1e4 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_1e0 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_1dc = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar137 < local_248) * local_248 | (uint)(iVar137 >= local_248) * iVar137;
  uVar232 = (uint)(iVar36 < local_248) * local_248 | (uint)(iVar36 >= local_248) * iVar36;
  uVar237 = (uint)(iVar40 < local_248) * local_248 | (uint)(iVar40 >= local_248) * iVar40;
  uVar242 = (uint)(iVar6 < local_248) * local_248 | (uint)(iVar6 >= local_248) * iVar6;
  local_198 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_194 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_190 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_18c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar25 < local_248) * local_248 | (uint)(iVar25 >= local_248) * iVar25;
  uVar232 = (uint)(iVar28 < local_248) * local_248 | (uint)(iVar28 >= local_248) * iVar28;
  uVar237 = (uint)(iVar31 < local_248) * local_248 | (uint)(iVar31 >= local_248) * iVar31;
  uVar242 = (uint)(iVar35 < local_248) * local_248 | (uint)(iVar35 >= local_248) * iVar35;
  uVar97 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar103 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar105 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar107 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar185 < local_248) * local_248 | (uint)(iVar185 >= local_248) * iVar185;
  uVar232 = (uint)(iVar2 < local_248) * local_248 | (uint)(iVar2 >= local_248) * iVar2;
  uVar237 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  uVar242 = (uint)(iVar23 < local_248) * local_248 | (uint)(iVar23 >= local_248) * iVar23;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  iVar136 = uVar97 + uVar220;
  iVar168 = uVar103 + uVar232;
  iVar176 = uVar105 + uVar237;
  iVar178 = uVar107 + uVar242;
  iVar137 = uVar220 - uVar97;
  iVar185 = uVar232 - uVar103;
  iVar36 = uVar237 - uVar105;
  iVar40 = uVar242 - uVar107;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  local_1d8 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_1d4 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_1d0 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_1cc = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar137 < local_248) * local_248 | (uint)(iVar137 >= local_248) * iVar137;
  uVar232 = (uint)(iVar185 < local_248) * local_248 | (uint)(iVar185 >= local_248) * iVar185;
  uVar237 = (uint)(iVar36 < local_248) * local_248 | (uint)(iVar36 >= local_248) * iVar36;
  uVar242 = (uint)(iVar40 < local_248) * local_248 | (uint)(iVar40 >= local_248) * iVar40;
  local_1a8 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_1a4 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_1a0 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_19c = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar220 = (uint)(iVar71 < local_248) * local_248 | (uint)(iVar71 >= local_248) * iVar71;
  uVar232 = (uint)(iVar76 < local_248) * local_248 | (uint)(iVar76 >= local_248) * iVar76;
  uVar237 = (uint)(iVar83 < local_248) * local_248 | (uint)(iVar83 >= local_248) * iVar83;
  uVar242 = (uint)(iVar84 < local_248) * local_248 | (uint)(iVar84 >= local_248) * iVar84;
  uVar220 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar232 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uVar237 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar97 = (uint)(iVar184 < local_248) * local_248 | (uint)(iVar184 >= local_248) * iVar184;
  uVar103 = (uint)(iVar41 < local_248) * local_248 | (uint)(iVar41 >= local_248) * iVar41;
  uVar105 = (uint)(iVar7 < local_248) * local_248 | (uint)(iVar7 >= local_248) * iVar7;
  uVar107 = (uint)(iVar65 < local_248) * local_248 | (uint)(iVar65 >= local_248) * iVar65;
  uVar97 = (uint)(local_258 < (int)uVar97) * local_258 | (local_258 >= (int)uVar97) * uVar97;
  uVar103 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar105 = (uint)(local_258 < (int)uVar105) * local_258 | (local_258 >= (int)uVar105) * uVar105;
  uVar107 = (uint)(local_258 < (int)uVar107) * local_258 | (local_258 >= (int)uVar107) * uVar107;
  iVar136 = uVar220 + uVar97;
  iVar168 = uVar232 + uVar103;
  iVar176 = uVar237 + uVar105;
  iVar178 = uVar242 + uVar107;
  iVar137 = uVar97 - uVar220;
  iVar184 = uVar103 - uVar232;
  iVar185 = uVar105 - uVar237;
  iVar36 = uVar107 - uVar242;
  uVar97 = (uint)(iVar42 < local_248) * local_248 | (uint)(iVar42 >= local_248) * iVar42;
  uVar103 = (uint)(iVar118 < local_248) * local_248 | (uint)(iVar118 >= local_248) * iVar118;
  uVar105 = (uint)(iVar126 < local_248) * local_248 | (uint)(iVar126 >= local_248) * iVar126;
  uVar107 = (uint)(iVar53 < local_248) * local_248 | (uint)(iVar53 >= local_248) * iVar53;
  uVar98 = (uint)(iVar26 < local_248) * local_248 | (uint)(iVar26 >= local_248) * iVar26;
  uVar104 = (uint)(iVar29 < local_248) * local_248 | (uint)(iVar29 >= local_248) * iVar29;
  uVar106 = (uint)(iVar32 < local_248) * local_248 | (uint)(iVar32 >= local_248) * iVar32;
  uVar108 = (uint)(iVar195 < local_248) * local_248 | (uint)(iVar195 >= local_248) * iVar195;
  uVar223 = (uint)(iVar12 < local_248) * local_248 | (uint)(iVar12 >= local_248) * iVar12;
  uVar235 = (uint)(iVar3 < local_248) * local_248 | (uint)(iVar3 >= local_248) * iVar3;
  uVar240 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar245 = (uint)(iVar24 < local_248) * local_248 | (uint)(iVar24 >= local_248) * iVar24;
  uVar77 = (uint)(iVar30 < local_248) * local_248 | (uint)(iVar30 >= local_248) * iVar30;
  uVar86 = (uint)(iVar4 < local_248) * local_248 | (uint)(iVar4 >= local_248) * iVar4;
  uVar91 = (uint)(iVar21 < local_248) * local_248 | (uint)(iVar21 >= local_248) * iVar21;
  uVar96 = (uint)(iVar87 < local_248) * local_248 | (uint)(iVar87 >= local_248) * iVar87;
  uVar187 = (uint)(iVar43 < local_248) * local_248 | (uint)(iVar43 >= local_248) * iVar43;
  uVar196 = (uint)(iVar45 < local_248) * local_248 | (uint)(iVar45 >= local_248) * iVar45;
  uVar198 = (uint)(iVar49 < local_248) * local_248 | (uint)(iVar49 >= local_248) * iVar49;
  uVar200 = (uint)(iVar50 < local_248) * local_248 | (uint)(iVar50 >= local_248) * iVar50;
  uVar150 = (uint)(iVar197 < local_248) * local_248 | (uint)(iVar197 >= local_248) * iVar197;
  uVar162 = (uint)(iVar37 < local_248) * local_248 | (uint)(iVar37 >= local_248) * iVar37;
  uVar164 = (uint)(iVar38 < local_248) * local_248 | (uint)(iVar38 >= local_248) * iVar38;
  uVar166 = (uint)(iVar39 < local_248) * local_248 | (uint)(iVar39 >= local_248) * iVar39;
  uVar208 = (uint)(iVar33 < local_248) * local_248 | (uint)(iVar33 >= local_248) * iVar33;
  uVar211 = (uint)(iVar5 < local_248) * local_248 | (uint)(iVar5 >= local_248) * iVar5;
  uVar212 = (uint)(iVar82 < local_248) * local_248 | (uint)(iVar82 >= local_248) * iVar82;
  uVar213 = (uint)(iVar92 < local_248) * local_248 | (uint)(iVar92 >= local_248) * iVar92;
  uVar111 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uVar120 = (uint)(iVar125 < local_248) * local_248 | (uint)(iVar125 >= local_248) * iVar125;
  uVar124 = (uint)(iVar186 < local_248) * local_248 | (uint)(iVar186 >= local_248) * iVar186;
  uVar128 = (uint)(iVar34 < local_248) * local_248 | (uint)(iVar34 >= local_248) * iVar34;
  uVar220 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar232 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar237 = (uint)(iVar176 < local_248) * local_248 | (uint)(iVar176 >= local_248) * iVar176;
  uVar242 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  uVar47 = (uint)(iVar137 < local_248) * local_248 | (uint)(iVar137 >= local_248) * iVar137;
  uVar55 = (uint)(iVar184 < local_248) * local_248 | (uint)(iVar184 >= local_248) * iVar184;
  uVar64 = (uint)(iVar185 < local_248) * local_248 | (uint)(iVar185 >= local_248) * iVar185;
  uVar73 = (uint)(iVar36 < local_248) * local_248 | (uint)(iVar36 >= local_248) * iVar36;
  auVar152._0_4_ = (uint)(local_258 < (int)uVar97) * local_258 | (local_258 >= (int)uVar97) * uVar97
  ;
  auVar152._4_4_ =
       (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  auVar152._8_4_ =
       (uint)(local_258 < (int)uVar105) * local_258 | (local_258 >= (int)uVar105) * uVar105;
  auVar152._12_4_ =
       (uint)(local_258 < (int)uVar107) * local_258 | (local_258 >= (int)uVar107) * uVar107;
  auVar102._0_4_ = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98
  ;
  auVar102._4_4_ =
       (uint)(local_258 < (int)uVar104) * local_258 | (local_258 >= (int)uVar104) * uVar104;
  auVar102._8_4_ =
       (uint)(local_258 < (int)uVar106) * local_258 | (local_258 >= (int)uVar106) * uVar106;
  auVar102._12_4_ =
       (uint)(local_258 < (int)uVar108) * local_258 | (local_258 >= (int)uVar108) * uVar108;
  auVar230._0_4_ =
       (uint)(local_258 < (int)uVar223) * local_258 | (local_258 >= (int)uVar223) * uVar223;
  auVar230._4_4_ =
       (uint)(local_258 < (int)uVar235) * local_258 | (local_258 >= (int)uVar235) * uVar235;
  auVar230._8_4_ =
       (uint)(local_258 < (int)uVar240) * local_258 | (local_258 >= (int)uVar240) * uVar240;
  auVar230._12_4_ =
       (uint)(local_258 < (int)uVar245) * local_258 | (local_258 >= (int)uVar245) * uVar245;
  auVar81._0_4_ = (uint)(local_258 < (int)uVar77) * local_258 | (local_258 >= (int)uVar77) * uVar77;
  auVar81._4_4_ = (uint)(local_258 < (int)uVar86) * local_258 | (local_258 >= (int)uVar86) * uVar86;
  auVar81._8_4_ = (uint)(local_258 < (int)uVar91) * local_258 | (local_258 >= (int)uVar91) * uVar91;
  auVar81._12_4_ = (uint)(local_258 < (int)uVar96) * local_258 | (local_258 >= (int)uVar96) * uVar96
  ;
  auVar193._0_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar193._4_4_ =
       (uint)(local_258 < (int)uVar196) * local_258 | (local_258 >= (int)uVar196) * uVar196;
  auVar193._8_4_ =
       (uint)(local_258 < (int)uVar198) * local_258 | (local_258 >= (int)uVar198) * uVar198;
  auVar193._12_4_ =
       (uint)(local_258 < (int)uVar200) * local_258 | (local_258 >= (int)uVar200) * uVar200;
  auVar159._0_4_ =
       (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  auVar159._4_4_ =
       (uint)(local_258 < (int)uVar162) * local_258 | (local_258 >= (int)uVar162) * uVar162;
  auVar159._8_4_ =
       (uint)(local_258 < (int)uVar164) * local_258 | (local_258 >= (int)uVar164) * uVar164;
  auVar159._12_4_ =
       (uint)(local_258 < (int)uVar166) * local_258 | (local_258 >= (int)uVar166) * uVar166;
  auVar209._0_4_ =
       (uint)(local_258 < (int)uVar208) * local_258 | (local_258 >= (int)uVar208) * uVar208;
  auVar209._4_4_ =
       (uint)(local_258 < (int)uVar211) * local_258 | (local_258 >= (int)uVar211) * uVar211;
  auVar209._8_4_ =
       (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  auVar209._12_4_ =
       (uint)(local_258 < (int)uVar213) * local_258 | (local_258 >= (int)uVar213) * uVar213;
  auVar116._0_4_ =
       (uint)(local_258 < (int)uVar111) * local_258 | (local_258 >= (int)uVar111) * uVar111;
  auVar116._4_4_ =
       (uint)(local_258 < (int)uVar120) * local_258 | (local_258 >= (int)uVar120) * uVar120;
  auVar116._8_4_ =
       (uint)(local_258 < (int)uVar124) * local_258 | (local_258 >= (int)uVar124) * uVar124;
  auVar116._12_4_ =
       (uint)(local_258 < (int)uVar128) * local_258 | (local_258 >= (int)uVar128) * uVar128;
  local_1c8 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uStack_1c4 = (uint)(local_258 < (int)uVar232) * local_258 | (local_258 >= (int)uVar232) * uVar232;
  uStack_1c0 = (uint)(local_258 < (int)uVar237) * local_258 | (local_258 >= (int)uVar237) * uVar237;
  uStack_1bc = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  local_1b8 = (uint)(local_258 < (int)uVar47) * local_258 | (local_258 >= (int)uVar47) * uVar47;
  uStack_1b4 = (uint)(local_258 < (int)uVar55) * local_258 | (local_258 >= (int)uVar55) * uVar55;
  uStack_1b0 = (uint)(local_258 < (int)uVar64) * local_258 | (local_258 >= (int)uVar64) * uVar64;
  uStack_1ac = (uint)(local_258 < (int)uVar73) * local_258 | (local_258 >= (int)uVar73) * uVar73;
  auVar117._0_4_ = auVar116._0_4_ + auVar81._0_4_;
  auVar117._4_4_ = auVar116._4_4_ + auVar81._4_4_;
  auVar117._8_4_ = auVar116._8_4_ + auVar81._8_4_;
  auVar117._12_4_ = auVar116._12_4_ + auVar81._12_4_;
  auVar14 = pmulld(auVar81,auVar144);
  auVar13 = pmulld(auVar116,auVar227);
  auVar15 = pmulld(auVar117,auVar227);
  local_88 = auVar15._0_4_ + iVar9 >> auVar133;
  iStack_84 = auVar15._4_4_ + iVar9 >> auVar133;
  iStack_80 = auVar15._8_4_ + iVar9 >> auVar133;
  iStack_7c = auVar15._12_4_ + iVar9 >> auVar133;
  local_f8 = auVar14._0_4_ + iVar9 + auVar13._0_4_ >> auVar133;
  iStack_f4 = auVar14._4_4_ + iVar9 + auVar13._4_4_ >> auVar133;
  iStack_f0 = auVar14._8_4_ + iVar9 + auVar13._8_4_ >> auVar133;
  iStack_ec = auVar14._12_4_ + iVar9 + auVar13._12_4_ >> auVar133;
  auVar210._0_4_ = auVar209._0_4_ + auVar230._0_4_;
  auVar210._4_4_ = auVar209._4_4_ + auVar230._4_4_;
  auVar210._8_4_ = auVar209._8_4_ + auVar230._8_4_;
  auVar210._12_4_ = auVar209._12_4_ + auVar230._12_4_;
  auVar14 = pmulld(auVar230,auVar144);
  auVar13 = pmulld(auVar209,auVar227);
  auVar15 = pmulld(auVar210,auVar227);
  local_98 = auVar15._0_4_ + iVar9 >> auVar133;
  iStack_94 = auVar15._4_4_ + iVar9 >> auVar133;
  iStack_90 = auVar15._8_4_ + iVar9 >> auVar133;
  iStack_8c = auVar15._12_4_ + iVar9 >> auVar133;
  local_e8 = auVar14._0_4_ + iVar9 + auVar13._0_4_ >> auVar133;
  iStack_e4 = auVar14._4_4_ + iVar9 + auVar13._4_4_ >> auVar133;
  iStack_e0 = auVar14._8_4_ + iVar9 + auVar13._8_4_ >> auVar133;
  iStack_dc = auVar14._12_4_ + iVar9 + auVar13._12_4_ >> auVar133;
  auVar160._0_4_ = auVar159._0_4_ + auVar102._0_4_;
  auVar160._4_4_ = auVar159._4_4_ + auVar102._4_4_;
  auVar160._8_4_ = auVar159._8_4_ + auVar102._8_4_;
  auVar160._12_4_ = auVar159._12_4_ + auVar102._12_4_;
  auVar14 = pmulld(auVar102,auVar144);
  auVar13 = pmulld(auVar159,auVar227);
  local_d8 = auVar14._0_4_ + iVar9 + auVar13._0_4_ >> auVar133;
  iStack_d4 = auVar14._4_4_ + iVar9 + auVar13._4_4_ >> auVar133;
  iStack_d0 = auVar14._8_4_ + iVar9 + auVar13._8_4_ >> auVar133;
  iStack_cc = auVar14._12_4_ + iVar9 + auVar13._12_4_ >> auVar133;
  auVar13 = pmulld(auVar160,auVar227);
  local_a8 = auVar13._0_4_ + iVar9 >> auVar133;
  iStack_a4 = auVar13._4_4_ + iVar9 >> auVar133;
  iStack_a0 = auVar13._8_4_ + iVar9 >> auVar133;
  iStack_9c = auVar13._12_4_ + iVar9 >> auVar133;
  auVar14 = pmulld(auVar144,auVar152);
  auVar13 = pmulld(auVar193,auVar227);
  auVar194._0_4_ = auVar193._0_4_ + auVar152._0_4_;
  auVar194._4_4_ = auVar193._4_4_ + auVar152._4_4_;
  auVar194._8_4_ = auVar193._8_4_ + auVar152._8_4_;
  auVar194._12_4_ = auVar193._12_4_ + auVar152._12_4_;
  auVar15 = pmulld(auVar194,auVar227);
  local_c8 = auVar13._0_4_ + iVar9 + auVar14._0_4_ >> auVar133;
  iStack_c4 = auVar13._4_4_ + iVar9 + auVar14._4_4_ >> auVar133;
  iStack_c0 = auVar13._8_4_ + iVar9 + auVar14._8_4_ >> auVar133;
  iStack_bc = auVar13._12_4_ + iVar9 + auVar14._12_4_ >> auVar133;
  local_b8 = auVar15._0_4_ + iVar9 >> auVar133;
  iStack_b4 = auVar15._4_4_ + iVar9 >> auVar133;
  iStack_b0 = auVar15._8_4_ + iVar9 >> auVar133;
  iStack_ac = auVar15._12_4_ + iVar9 >> auVar133;
  iStack_254 = local_258;
  iStack_250 = local_258;
  iStack_24c = local_258;
  iStack_244 = local_248;
  iStack_240 = local_248;
  iStack_23c = local_248;
  idct32_stage9_sse4_1
            ((__m128i *)&local_238,out,do_cols,bd,out_shift,(__m128i *)&local_248,
             (__m128i *)&local_258);
  return;
}

Assistant:

static void idct32x32_low16_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi30 = _mm_set1_epi32(cospi[30]);
  const __m128i cospi46 = _mm_set1_epi32(cospi[46]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi22 = _mm_set1_epi32(cospi[22]);
  const __m128i cospi38 = _mm_set1_epi32(cospi[38]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi26 = _mm_set1_epi32(cospi[26]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi18 = _mm_set1_epi32(cospi[18]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospim42 = _mm_set1_epi32(-cospi[42]);
  const __m128i cospim50 = _mm_set1_epi32(-cospi[50]);
  const __m128i cospim34 = _mm_set1_epi32(-cospi[34]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i rounding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i bf1[32];

  // stage 0
  // stage 1

  bf1[0] = in[0];
  bf1[2] = in[8];
  bf1[4] = in[4];
  bf1[6] = in[12];
  bf1[8] = in[2];
  bf1[10] = in[10];
  bf1[12] = in[6];
  bf1[14] = in[14];
  bf1[16] = in[1];
  bf1[18] = in[9];
  bf1[20] = in[5];
  bf1[22] = in[13];
  bf1[24] = in[3];
  bf1[26] = in[11];
  bf1[28] = in[7];
  bf1[30] = in[15];

  // stage 2
  bf1[31] = half_btf_0_sse4_1(&cospi2, &bf1[16], &rounding, bit);
  bf1[16] = half_btf_0_sse4_1(&cospi62, &bf1[16], &rounding, bit);
  bf1[17] = half_btf_0_sse4_1(&cospim34, &bf1[30], &rounding, bit);
  bf1[30] = half_btf_0_sse4_1(&cospi30, &bf1[30], &rounding, bit);
  bf1[29] = half_btf_0_sse4_1(&cospi18, &bf1[18], &rounding, bit);
  bf1[18] = half_btf_0_sse4_1(&cospi46, &bf1[18], &rounding, bit);
  bf1[19] = half_btf_0_sse4_1(&cospim50, &bf1[28], &rounding, bit);
  bf1[28] = half_btf_0_sse4_1(&cospi14, &bf1[28], &rounding, bit);
  bf1[27] = half_btf_0_sse4_1(&cospi10, &bf1[20], &rounding, bit);
  bf1[20] = half_btf_0_sse4_1(&cospi54, &bf1[20], &rounding, bit);
  bf1[21] = half_btf_0_sse4_1(&cospim42, &bf1[26], &rounding, bit);
  bf1[26] = half_btf_0_sse4_1(&cospi22, &bf1[26], &rounding, bit);
  bf1[25] = half_btf_0_sse4_1(&cospi26, &bf1[22], &rounding, bit);
  bf1[22] = half_btf_0_sse4_1(&cospi38, &bf1[22], &rounding, bit);
  bf1[23] = half_btf_0_sse4_1(&cospim58, &bf1[24], &rounding, bit);
  bf1[24] = half_btf_0_sse4_1(&cospi6, &bf1[24], &rounding, bit);

  // stage 3
  bf1[15] = half_btf_0_sse4_1(&cospi4, &bf1[8], &rounding, bit);
  bf1[8] = half_btf_0_sse4_1(&cospi60, &bf1[8], &rounding, bit);
  bf1[9] = half_btf_0_sse4_1(&cospim36, &bf1[14], &rounding, bit);
  bf1[14] = half_btf_0_sse4_1(&cospi28, &bf1[14], &rounding, bit);
  bf1[13] = half_btf_0_sse4_1(&cospi20, &bf1[10], &rounding, bit);
  bf1[10] = half_btf_0_sse4_1(&cospi44, &bf1[10], &rounding, bit);
  bf1[11] = half_btf_0_sse4_1(&cospim52, &bf1[12], &rounding, bit);
  bf1[12] = half_btf_0_sse4_1(&cospi12, &bf1[12], &rounding, bit);

  addsub_sse4_1(bf1[16], bf1[17], bf1 + 16, bf1 + 17, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[19], bf1[18], bf1 + 19, bf1 + 18, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[20], bf1[21], bf1 + 20, bf1 + 21, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[23], bf1[22], bf1 + 23, bf1 + 22, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[24], bf1[25], bf1 + 24, bf1 + 25, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[27], bf1[26], bf1 + 27, bf1 + 26, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[28], bf1[29], bf1 + 28, bf1 + 29, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[31], bf1[30], bf1 + 31, bf1 + 30, &clamp_lo, &clamp_hi);
  // stage 4
  bf1[7] = half_btf_0_sse4_1(&cospi8, &bf1[4], &rounding, bit);
  bf1[4] = half_btf_0_sse4_1(&cospi56, &bf1[4], &rounding, bit);
  bf1[5] = half_btf_0_sse4_1(&cospim40, &bf1[6], &rounding, bit);
  bf1[6] = half_btf_0_sse4_1(&cospi24, &bf1[6], &rounding, bit);

  addsub_sse4_1(bf1[8], bf1[9], bf1 + 8, bf1 + 9, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[11], bf1[10], bf1 + 11, bf1 + 10, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[12], bf1[13], bf1 + 12, bf1 + 13, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[15], bf1[14], bf1 + 15, bf1 + 14, &clamp_lo, &clamp_hi);

  idct32_stage4_sse4_1(bf1, &cospim8, &cospi56, &cospi8, &cospim56, &cospim40,
                       &cospi24, &cospi40, &cospim24, &rounding, bit);

  // stage 5
  bf1[0] = half_btf_0_sse4_1(&cospi32, &bf1[0], &rounding, bit);
  bf1[1] = bf1[0];
  bf1[3] = half_btf_0_sse4_1(&cospi16, &bf1[2], &rounding, bit);
  bf1[2] = half_btf_0_sse4_1(&cospi48, &bf1[2], &rounding, bit);

  addsub_sse4_1(bf1[4], bf1[5], bf1 + 4, bf1 + 5, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[7], bf1[6], bf1 + 7, bf1 + 6, &clamp_lo, &clamp_hi);

  idct32_stage5_sse4_1(bf1, &cospim16, &cospi48, &cospi16, &cospim48, &clamp_lo,
                       &clamp_hi, &rounding, bit);

  // stage 6
  addsub_sse4_1(bf1[0], bf1[3], bf1 + 0, bf1 + 3, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[1], bf1[2], bf1 + 1, bf1 + 2, &clamp_lo, &clamp_hi);

  idct32_stage6_sse4_1(bf1, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rounding, bit);

  // stage 7
  idct32_stage7_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

  // stage 8
  idct32_stage8_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);
  // stage 9
  idct32_stage9_sse4_1(bf1, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
}